

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::sse2::CurveNiIntersector1<4>::
     intersect_n<embree::sse2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,3,4>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  float *pfVar2;
  Primitive PVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  long lVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined3 uVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  bool bVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined6 uVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  byte bVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  int iVar42;
  RTCIntersectArguments *pRVar43;
  RTCIntersectArguments *pRVar44;
  RTCIntersectArguments *pRVar45;
  ulong uVar46;
  bool bVar47;
  uint uVar48;
  uint uVar49;
  int iVar50;
  uint uVar51;
  uint uVar52;
  short sVar53;
  float t1;
  float fVar54;
  undefined2 uVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar84;
  float fVar95;
  float fVar96;
  vfloat4 v;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar97;
  float fVar98;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar116;
  float fVar129;
  float fVar130;
  vfloat4 v_1;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  float fVar131;
  float fVar136;
  float fVar137;
  vfloat4 a;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar138;
  float fVar149;
  float fVar150;
  vfloat_impl<4> p00;
  undefined1 auVar139 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar151;
  float fVar165;
  float fVar166;
  undefined1 auVar152 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar167;
  float fVar188;
  float fVar189;
  undefined1 auVar168 [16];
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar190;
  float fVar204;
  float fVar205;
  undefined1 auVar191 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar206;
  float fVar215;
  float fVar216;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar217;
  float fVar222;
  float fVar223;
  vfloat4 a_1;
  float fVar224;
  float fVar225;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar226;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar234;
  float fVar235;
  float fVar240;
  float fVar242;
  float fVar244;
  undefined1 auVar236 [16];
  float fVar241;
  float fVar243;
  float fVar245;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar246;
  float fVar250;
  float fVar251;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float fStack_420;
  float fStack_41c;
  undefined8 local_418;
  undefined1 local_3fc [8];
  float fStack_3f4;
  undefined8 uStack_3f0;
  float local_3e8;
  float fStack_3e4;
  undefined8 uStack_3e0;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  anon_union_12_2_4062524c_for_Vec3<float>_1 aStack_3cc;
  ulong local_3c0;
  float local_3b8;
  float fStack_3b4;
  uint auStack_3b0 [1];
  uint auStack_3ac [1];
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  ulong local_2e0;
  RTCFilterFunctionNArguments local_2d8;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  uint auStack_1e8 [4];
  undefined8 local_1d8;
  float local_1d0;
  float local_1cc;
  float fStack_1c8;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  uint local_1b8;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  undefined8 auStack_58 [5];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 uVar80;
  undefined1 auVar127 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  
  PVar3 = prim[1];
  uVar41 = (ulong)(byte)PVar3;
  pPVar1 = prim + uVar41 * 0x19 + 6;
  fVar96 = *(float *)(pPVar1 + 0xc);
  fVar116 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar1) * fVar96;
  fVar129 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar1 + 4)) * fVar96;
  fVar130 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar1 + 8)) * fVar96;
  fVar84 = fVar96 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar95 = fVar96 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar96 = fVar96 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar4 = *(undefined4 *)(prim + uVar41 * 4 + 6);
  uVar80 = (undefined1)((uint)uVar4 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar4));
  uVar80 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar80),uVar80);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar22,sVar53);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar46;
  auVar90._12_2_ = uVar81;
  auVar90._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar208._12_4_ = auVar90._12_4_;
  auVar208._8_2_ = 0;
  auVar208._0_8_ = uVar46;
  auVar208._10_2_ = uVar81;
  auVar62._10_6_ = auVar208._10_6_;
  auVar62._8_2_ = uVar81;
  auVar62._0_8_ = uVar46;
  uVar81 = (undefined2)uVar22;
  auVar23._4_8_ = auVar62._8_8_;
  auVar23._2_2_ = uVar81;
  auVar23._0_2_ = uVar81;
  fVar97 = (float)((int)sVar53 >> 8);
  fVar113 = (float)(auVar23._0_4_ >> 0x18);
  fVar114 = (float)(auVar62._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar41 * 5 + 6);
  uVar80 = (undefined1)((uint)uVar4 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar4));
  uVar80 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar80),uVar80);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar22,sVar53);
  auVar55._8_4_ = 0;
  auVar55._0_8_ = uVar46;
  auVar55._12_2_ = uVar81;
  auVar55._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar253._12_4_ = auVar55._12_4_;
  auVar253._8_2_ = 0;
  auVar253._0_8_ = uVar46;
  auVar253._10_2_ = uVar81;
  auVar100._10_6_ = auVar253._10_6_;
  auVar100._8_2_ = uVar81;
  auVar100._0_8_ = uVar46;
  uVar81 = (undefined2)uVar22;
  auVar24._4_8_ = auVar100._8_8_;
  auVar24._2_2_ = uVar81;
  auVar24._0_2_ = uVar81;
  fVar131 = (float)((int)sVar53 >> 8);
  fVar136 = (float)(auVar24._0_4_ >> 0x18);
  fVar137 = (float)(auVar100._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar41 * 6 + 6);
  uVar80 = (undefined1)((uint)uVar4 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar4));
  uVar80 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar80),uVar80);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar22,sVar53);
  auVar58._8_4_ = 0;
  auVar58._0_8_ = uVar46;
  auVar58._12_2_ = uVar81;
  auVar58._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar57._12_4_ = auVar58._12_4_;
  auVar57._8_2_ = 0;
  auVar57._0_8_ = uVar46;
  auVar57._10_2_ = uVar81;
  auVar56._10_6_ = auVar57._10_6_;
  auVar56._8_2_ = uVar81;
  auVar56._0_8_ = uVar46;
  uVar81 = (undefined2)uVar22;
  auVar25._4_8_ = auVar56._8_8_;
  auVar25._2_2_ = uVar81;
  auVar25._0_2_ = uVar81;
  fVar138 = (float)((int)sVar53 >> 8);
  fVar149 = (float)(auVar25._0_4_ >> 0x18);
  fVar150 = (float)(auVar56._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar41 * 0xb + 6);
  uVar80 = (undefined1)((uint)uVar4 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar4));
  uVar80 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar80),uVar80);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar22,sVar53);
  auVar61._8_4_ = 0;
  auVar61._0_8_ = uVar46;
  auVar61._12_2_ = uVar81;
  auVar61._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar60._12_4_ = auVar61._12_4_;
  auVar60._8_2_ = 0;
  auVar60._0_8_ = uVar46;
  auVar60._10_2_ = uVar81;
  auVar59._10_6_ = auVar60._10_6_;
  auVar59._8_2_ = uVar81;
  auVar59._0_8_ = uVar46;
  uVar81 = (undefined2)uVar22;
  auVar26._4_8_ = auVar59._8_8_;
  auVar26._2_2_ = uVar81;
  auVar26._0_2_ = uVar81;
  fVar54 = (float)((int)sVar53 >> 8);
  fVar82 = (float)(auVar26._0_4_ >> 0x18);
  fVar83 = (float)(auVar59._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6);
  uVar80 = (undefined1)((uint)uVar4 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar4));
  uVar80 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar80),uVar80);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar22,sVar53);
  auVar154._8_4_ = 0;
  auVar154._0_8_ = uVar46;
  auVar154._12_2_ = uVar81;
  auVar154._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar153._12_4_ = auVar154._12_4_;
  auVar153._8_2_ = 0;
  auVar153._0_8_ = uVar46;
  auVar153._10_2_ = uVar81;
  auVar152._10_6_ = auVar153._10_6_;
  auVar152._8_2_ = uVar81;
  auVar152._0_8_ = uVar46;
  uVar81 = (undefined2)uVar22;
  auVar27._4_8_ = auVar152._8_8_;
  auVar27._2_2_ = uVar81;
  auVar27._0_2_ = uVar81;
  fVar151 = (float)((int)sVar53 >> 8);
  fVar165 = (float)(auVar27._0_4_ >> 0x18);
  fVar166 = (float)(auVar152._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + (uint)(byte)PVar3 * 0xc + uVar41 + 6);
  uVar80 = (undefined1)((uint)uVar4 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar4));
  uVar80 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar80),uVar80);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar22,sVar53);
  auVar170._8_4_ = 0;
  auVar170._0_8_ = uVar46;
  auVar170._12_2_ = uVar81;
  auVar170._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar169._12_4_ = auVar170._12_4_;
  auVar169._8_2_ = 0;
  auVar169._0_8_ = uVar46;
  auVar169._10_2_ = uVar81;
  auVar168._10_6_ = auVar169._10_6_;
  auVar168._8_2_ = uVar81;
  auVar168._0_8_ = uVar46;
  uVar81 = (undefined2)uVar22;
  auVar28._4_8_ = auVar168._8_8_;
  auVar28._2_2_ = uVar81;
  auVar28._0_2_ = uVar81;
  fVar206 = (float)((int)sVar53 >> 8);
  fVar215 = (float)(auVar28._0_4_ >> 0x18);
  fVar216 = (float)(auVar168._8_4_ >> 0x18);
  uVar39 = (ulong)(uint)((int)(uVar41 * 9) * 2);
  uVar4 = *(undefined4 *)(prim + uVar39 + 6);
  uVar80 = (undefined1)((uint)uVar4 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar4));
  uVar80 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar80),uVar80);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar22,sVar53);
  auVar173._8_4_ = 0;
  auVar173._0_8_ = uVar46;
  auVar173._12_2_ = uVar81;
  auVar173._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._8_2_ = 0;
  auVar172._0_8_ = uVar46;
  auVar172._10_2_ = uVar81;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._8_2_ = uVar81;
  auVar171._0_8_ = uVar46;
  uVar81 = (undefined2)uVar22;
  auVar29._4_8_ = auVar171._8_8_;
  auVar29._2_2_ = uVar81;
  auVar29._0_2_ = uVar81;
  fVar190 = (float)((int)sVar53 >> 8);
  fVar204 = (float)(auVar29._0_4_ >> 0x18);
  fVar205 = (float)(auVar171._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar39 + uVar41 + 6);
  uVar80 = (undefined1)((uint)uVar4 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar4));
  uVar80 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar80),uVar80);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar22,sVar53);
  auVar176._8_4_ = 0;
  auVar176._0_8_ = uVar46;
  auVar176._12_2_ = uVar81;
  auVar176._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._8_2_ = 0;
  auVar175._0_8_ = uVar46;
  auVar175._10_2_ = uVar81;
  auVar174._10_6_ = auVar175._10_6_;
  auVar174._8_2_ = uVar81;
  auVar174._0_8_ = uVar46;
  uVar81 = (undefined2)uVar22;
  auVar30._4_8_ = auVar174._8_8_;
  auVar30._2_2_ = uVar81;
  auVar30._0_2_ = uVar81;
  fVar217 = (float)((int)sVar53 >> 8);
  fVar222 = (float)(auVar30._0_4_ >> 0x18);
  fVar223 = (float)(auVar174._8_4_ >> 0x18);
  uVar39 = (ulong)(uint)((int)(uVar41 * 5) << 2);
  uVar4 = *(undefined4 *)(prim + uVar39 + 6);
  uVar80 = (undefined1)((uint)uVar4 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar4));
  uVar80 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar80),uVar80);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar22,sVar53);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar46;
  auVar179._12_2_ = uVar81;
  auVar179._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar46;
  auVar178._10_2_ = uVar81;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar81;
  auVar177._0_8_ = uVar46;
  uVar81 = (undefined2)uVar22;
  auVar31._4_8_ = auVar177._8_8_;
  auVar31._2_2_ = uVar81;
  auVar31._0_2_ = uVar81;
  fVar246 = (float)((int)sVar53 >> 8);
  fVar250 = (float)(auVar31._0_4_ >> 0x18);
  fVar251 = (float)(auVar177._8_4_ >> 0x18);
  fVar234 = fVar84 * fVar97 + fVar95 * fVar131 + fVar96 * fVar138;
  fVar240 = fVar84 * fVar113 + fVar95 * fVar136 + fVar96 * fVar149;
  fVar242 = fVar84 * fVar114 + fVar95 * fVar137 + fVar96 * fVar150;
  fVar244 = fVar84 * (float)(auVar208._12_4_ >> 0x18) +
            fVar95 * (float)(auVar253._12_4_ >> 0x18) + fVar96 * (float)(auVar57._12_4_ >> 0x18);
  fVar226 = fVar84 * fVar54 + fVar95 * fVar151 + fVar96 * fVar206;
  fVar231 = fVar84 * fVar82 + fVar95 * fVar165 + fVar96 * fVar215;
  fVar232 = fVar84 * fVar83 + fVar95 * fVar166 + fVar96 * fVar216;
  fVar233 = fVar84 * (float)(auVar60._12_4_ >> 0x18) +
            fVar95 * (float)(auVar153._12_4_ >> 0x18) + fVar96 * (float)(auVar169._12_4_ >> 0x18);
  fVar167 = fVar84 * fVar190 + fVar95 * fVar217 + fVar96 * fVar246;
  fVar188 = fVar84 * fVar204 + fVar95 * fVar222 + fVar96 * fVar250;
  fVar189 = fVar84 * fVar205 + fVar95 * fVar223 + fVar96 * fVar251;
  fVar84 = fVar84 * (float)(auVar172._12_4_ >> 0x18) +
           fVar95 * (float)(auVar175._12_4_ >> 0x18) + fVar96 * (float)(auVar178._12_4_ >> 0x18);
  fVar98 = fVar97 * fVar116 + fVar131 * fVar129 + fVar138 * fVar130;
  fVar149 = fVar113 * fVar116 + fVar136 * fVar129 + fVar149 * fVar130;
  fVar150 = fVar114 * fVar116 + fVar137 * fVar129 + fVar150 * fVar130;
  fVar115 = (float)(auVar208._12_4_ >> 0x18) * fVar116 +
            (float)(auVar253._12_4_ >> 0x18) * fVar129 + (float)(auVar57._12_4_ >> 0x18) * fVar130;
  fVar151 = fVar54 * fVar116 + fVar151 * fVar129 + fVar206 * fVar130;
  fVar165 = fVar82 * fVar116 + fVar165 * fVar129 + fVar215 * fVar130;
  fVar166 = fVar83 * fVar116 + fVar166 * fVar129 + fVar216 * fVar130;
  fVar206 = (float)(auVar60._12_4_ >> 0x18) * fVar116 +
            (float)(auVar153._12_4_ >> 0x18) * fVar129 + (float)(auVar169._12_4_ >> 0x18) * fVar130;
  fVar131 = fVar116 * fVar190 + fVar129 * fVar217 + fVar130 * fVar246;
  fVar136 = fVar116 * fVar204 + fVar129 * fVar222 + fVar130 * fVar250;
  fVar137 = fVar116 * fVar205 + fVar129 * fVar223 + fVar130 * fVar251;
  fVar138 = fVar116 * (float)(auVar172._12_4_ >> 0x18) +
            fVar129 * (float)(auVar175._12_4_ >> 0x18) + fVar130 * (float)(auVar178._12_4_ >> 0x18);
  fVar96 = (float)DAT_01ff1d40;
  fVar54 = DAT_01ff1d40._4_4_;
  fVar82 = DAT_01ff1d40._8_4_;
  fVar83 = DAT_01ff1d40._12_4_;
  uVar48 = -(uint)(fVar96 <= ABS(fVar234));
  uVar49 = -(uint)(fVar54 <= ABS(fVar240));
  uVar51 = -(uint)(fVar82 <= ABS(fVar242));
  uVar52 = -(uint)(fVar83 <= ABS(fVar244));
  auVar236._0_4_ = (uint)fVar234 & uVar48;
  auVar236._4_4_ = (uint)fVar240 & uVar49;
  auVar236._8_4_ = (uint)fVar242 & uVar51;
  auVar236._12_4_ = (uint)fVar244 & uVar52;
  auVar117._0_4_ = ~uVar48 & (uint)fVar96;
  auVar117._4_4_ = ~uVar49 & (uint)fVar54;
  auVar117._8_4_ = ~uVar51 & (uint)fVar82;
  auVar117._12_4_ = ~uVar52 & (uint)fVar83;
  auVar117 = auVar117 | auVar236;
  uVar48 = -(uint)(fVar96 <= ABS(fVar226));
  uVar49 = -(uint)(fVar54 <= ABS(fVar231));
  uVar51 = -(uint)(fVar82 <= ABS(fVar232));
  uVar52 = -(uint)(fVar83 <= ABS(fVar233));
  auVar227._0_4_ = (uint)fVar226 & uVar48;
  auVar227._4_4_ = (uint)fVar231 & uVar49;
  auVar227._8_4_ = (uint)fVar232 & uVar51;
  auVar227._12_4_ = (uint)fVar233 & uVar52;
  auVar132._0_4_ = ~uVar48 & (uint)fVar96;
  auVar132._4_4_ = ~uVar49 & (uint)fVar54;
  auVar132._8_4_ = ~uVar51 & (uint)fVar82;
  auVar132._12_4_ = ~uVar52 & (uint)fVar83;
  auVar132 = auVar132 | auVar227;
  uVar48 = -(uint)(fVar96 <= ABS(fVar167));
  uVar49 = -(uint)(fVar54 <= ABS(fVar188));
  uVar51 = -(uint)(fVar82 <= ABS(fVar189));
  uVar52 = -(uint)(fVar83 <= ABS(fVar84));
  auVar180._0_4_ = (uint)fVar167 & uVar48;
  auVar180._4_4_ = (uint)fVar188 & uVar49;
  auVar180._8_4_ = (uint)fVar189 & uVar51;
  auVar180._12_4_ = (uint)fVar84 & uVar52;
  auVar155._0_4_ = ~uVar48 & (uint)fVar96;
  auVar155._4_4_ = ~uVar49 & (uint)fVar54;
  auVar155._8_4_ = ~uVar51 & (uint)fVar82;
  auVar155._12_4_ = ~uVar52 & (uint)fVar83;
  auVar155 = auVar155 | auVar180;
  auVar62 = rcpps(_DAT_01ff1d40,auVar117);
  fVar96 = auVar62._0_4_;
  fVar83 = auVar62._4_4_;
  fVar97 = auVar62._8_4_;
  fVar116 = auVar62._12_4_;
  fVar96 = (1.0 - auVar117._0_4_ * fVar96) * fVar96 + fVar96;
  fVar83 = (1.0 - auVar117._4_4_ * fVar83) * fVar83 + fVar83;
  fVar97 = (1.0 - auVar117._8_4_ * fVar97) * fVar97 + fVar97;
  fVar116 = (1.0 - auVar117._12_4_ * fVar116) * fVar116 + fVar116;
  auVar62 = rcpps(auVar62,auVar132);
  fVar54 = auVar62._0_4_;
  fVar84 = auVar62._4_4_;
  fVar113 = auVar62._8_4_;
  fVar129 = auVar62._12_4_;
  fVar54 = (1.0 - auVar132._0_4_ * fVar54) * fVar54 + fVar54;
  fVar84 = (1.0 - auVar132._4_4_ * fVar84) * fVar84 + fVar84;
  fVar113 = (1.0 - auVar132._8_4_ * fVar113) * fVar113 + fVar113;
  fVar129 = (1.0 - auVar132._12_4_ * fVar129) * fVar129 + fVar129;
  auVar62 = rcpps(auVar62,auVar155);
  fVar82 = auVar62._0_4_;
  fVar95 = auVar62._4_4_;
  fVar114 = auVar62._8_4_;
  fVar130 = auVar62._12_4_;
  fVar82 = (1.0 - auVar155._0_4_ * fVar82) * fVar82 + fVar82;
  fVar95 = (1.0 - auVar155._4_4_ * fVar95) * fVar95 + fVar95;
  fVar114 = (1.0 - auVar155._8_4_ * fVar114) * fVar114 + fVar114;
  fVar130 = (1.0 - auVar155._12_4_ * fVar130) * fVar130 + fVar130;
  uVar46 = *(ulong *)(prim + uVar41 * 7 + 6);
  uVar81 = (undefined2)(uVar46 >> 0x30);
  auVar65._8_4_ = 0;
  auVar65._0_8_ = uVar46;
  auVar65._12_2_ = uVar81;
  auVar65._14_2_ = uVar81;
  uVar81 = (undefined2)(uVar46 >> 0x20);
  auVar64._12_4_ = auVar65._12_4_;
  auVar64._8_2_ = 0;
  auVar64._0_8_ = uVar46;
  auVar64._10_2_ = uVar81;
  auVar63._10_6_ = auVar64._10_6_;
  auVar63._8_2_ = uVar81;
  auVar63._0_8_ = uVar46;
  uVar81 = (undefined2)(uVar46 >> 0x10);
  auVar32._4_8_ = auVar63._8_8_;
  auVar32._2_2_ = uVar81;
  auVar32._0_2_ = uVar81;
  auVar118._0_8_ =
       CONCAT44(((float)(auVar32._0_4_ >> 0x10) - fVar149) * fVar83,
                ((float)(int)(short)uVar46 - fVar98) * fVar96);
  auVar118._8_4_ = ((float)(auVar63._8_4_ >> 0x10) - fVar150) * fVar97;
  auVar118._12_4_ = ((float)(auVar64._12_4_ >> 0x10) - fVar115) * fVar116;
  uVar46 = *(ulong *)(prim + uVar41 * 9 + 6);
  uVar81 = (undefined2)(uVar46 >> 0x30);
  auVar68._8_4_ = 0;
  auVar68._0_8_ = uVar46;
  auVar68._12_2_ = uVar81;
  auVar68._14_2_ = uVar81;
  uVar81 = (undefined2)(uVar46 >> 0x20);
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._8_2_ = 0;
  auVar67._0_8_ = uVar46;
  auVar67._10_2_ = uVar81;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._8_2_ = uVar81;
  auVar66._0_8_ = uVar46;
  uVar81 = (undefined2)(uVar46 >> 0x10);
  auVar33._4_8_ = auVar66._8_8_;
  auVar33._2_2_ = uVar81;
  auVar33._0_2_ = uVar81;
  auVar156._0_4_ = ((float)(int)(short)uVar46 - fVar98) * fVar96;
  auVar156._4_4_ = ((float)(auVar33._0_4_ >> 0x10) - fVar149) * fVar83;
  auVar156._8_4_ = ((float)(auVar66._8_4_ >> 0x10) - fVar150) * fVar97;
  auVar156._12_4_ = ((float)(auVar67._12_4_ >> 0x10) - fVar115) * fVar116;
  lVar40 = uVar39 + uVar41;
  uVar46 = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  uVar39 = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar41 * -2 + 6);
  uVar81 = (undefined2)(uVar39 >> 0x30);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar39;
  auVar183._12_2_ = uVar81;
  auVar183._14_2_ = uVar81;
  uVar81 = (undefined2)(uVar39 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar39;
  auVar182._10_2_ = uVar81;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar81;
  auVar181._0_8_ = uVar39;
  uVar81 = (undefined2)(uVar39 >> 0x10);
  auVar34._4_8_ = auVar181._8_8_;
  auVar34._2_2_ = uVar81;
  auVar34._0_2_ = uVar81;
  auVar184._0_8_ =
       CONCAT44(((float)(auVar34._0_4_ >> 0x10) - fVar165) * fVar84,
                ((float)(int)(short)uVar39 - fVar151) * fVar54);
  auVar184._8_4_ = ((float)(auVar181._8_4_ >> 0x10) - fVar166) * fVar113;
  auVar184._12_4_ = ((float)(auVar182._12_4_ >> 0x10) - fVar206) * fVar129;
  uVar81 = (undefined2)(uVar46 >> 0x30);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar46;
  auVar71._12_2_ = uVar81;
  auVar71._14_2_ = uVar81;
  uVar81 = (undefined2)(uVar46 >> 0x20);
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar46;
  auVar70._10_2_ = uVar81;
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._8_2_ = uVar81;
  auVar69._0_8_ = uVar46;
  uVar81 = (undefined2)(uVar46 >> 0x10);
  auVar35._4_8_ = auVar69._8_8_;
  auVar35._2_2_ = uVar81;
  auVar35._0_2_ = uVar81;
  auVar72._0_4_ = ((float)(int)(short)uVar46 - fVar151) * fVar54;
  auVar72._4_4_ = ((float)(auVar35._0_4_ >> 0x10) - fVar165) * fVar84;
  auVar72._8_4_ = ((float)(auVar69._8_4_ >> 0x10) - fVar166) * fVar113;
  auVar72._12_4_ = ((float)(auVar70._12_4_ >> 0x10) - fVar206) * fVar129;
  uVar46 = *(ulong *)(prim + lVar40 + 6);
  uVar81 = (undefined2)(uVar46 >> 0x30);
  auVar141._8_4_ = 0;
  auVar141._0_8_ = uVar46;
  auVar141._12_2_ = uVar81;
  auVar141._14_2_ = uVar81;
  uVar81 = (undefined2)(uVar46 >> 0x20);
  auVar140._12_4_ = auVar141._12_4_;
  auVar140._8_2_ = 0;
  auVar140._0_8_ = uVar46;
  auVar140._10_2_ = uVar81;
  auVar139._10_6_ = auVar140._10_6_;
  auVar139._8_2_ = uVar81;
  auVar139._0_8_ = uVar46;
  uVar81 = (undefined2)(uVar46 >> 0x10);
  auVar36._4_8_ = auVar139._8_8_;
  auVar36._2_2_ = uVar81;
  auVar36._0_2_ = uVar81;
  auVar142._0_8_ =
       CONCAT44(((float)(auVar36._0_4_ >> 0x10) - fVar136) * fVar95,
                ((float)(int)(short)uVar46 - fVar131) * fVar82);
  auVar142._8_4_ = ((float)(auVar139._8_4_ >> 0x10) - fVar137) * fVar114;
  auVar142._12_4_ = ((float)(auVar140._12_4_ >> 0x10) - fVar138) * fVar130;
  uVar46 = *(ulong *)(prim + uVar41 * 0x17 + 6);
  uVar81 = (undefined2)(uVar46 >> 0x30);
  auVar193._8_4_ = 0;
  auVar193._0_8_ = uVar46;
  auVar193._12_2_ = uVar81;
  auVar193._14_2_ = uVar81;
  uVar81 = (undefined2)(uVar46 >> 0x20);
  auVar192._12_4_ = auVar193._12_4_;
  auVar192._8_2_ = 0;
  auVar192._0_8_ = uVar46;
  auVar192._10_2_ = uVar81;
  auVar191._10_6_ = auVar192._10_6_;
  auVar191._8_2_ = uVar81;
  auVar191._0_8_ = uVar46;
  uVar81 = (undefined2)(uVar46 >> 0x10);
  auVar37._4_8_ = auVar191._8_8_;
  auVar37._2_2_ = uVar81;
  auVar37._0_2_ = uVar81;
  auVar194._0_4_ = ((float)(int)(short)uVar46 - fVar131) * fVar82;
  auVar194._4_4_ = ((float)(auVar37._0_4_ >> 0x10) - fVar136) * fVar95;
  auVar194._8_4_ = ((float)(auVar191._8_4_ >> 0x10) - fVar137) * fVar114;
  auVar194._12_4_ = ((float)(auVar192._12_4_ >> 0x10) - fVar138) * fVar130;
  auVar207._8_4_ = auVar118._8_4_;
  auVar207._0_8_ = auVar118._0_8_;
  auVar207._12_4_ = auVar118._12_4_;
  auVar208 = minps(auVar207,auVar156);
  auVar85._8_4_ = auVar184._8_4_;
  auVar85._0_8_ = auVar184._0_8_;
  auVar85._12_4_ = auVar184._12_4_;
  auVar62 = minps(auVar85,auVar72);
  auVar208 = maxps(auVar208,auVar62);
  auVar86._8_4_ = auVar142._8_4_;
  auVar86._0_8_ = auVar142._0_8_;
  auVar86._12_4_ = auVar142._12_4_;
  auVar62 = minps(auVar86,auVar194);
  uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar133._4_4_ = uVar4;
  auVar133._0_4_ = uVar4;
  auVar133._8_4_ = uVar4;
  auVar133._12_4_ = uVar4;
  auVar62 = maxps(auVar62,auVar133);
  auVar62 = maxps(auVar208,auVar62);
  local_1a8 = auVar62._0_4_ * 0.99999964;
  fStack_1a4 = auVar62._4_4_ * 0.99999964;
  fStack_1a0 = auVar62._8_4_ * 0.99999964;
  fStack_19c = auVar62._12_4_ * 0.99999964;
  auVar62 = maxps(auVar118,auVar156);
  auVar208 = maxps(auVar184,auVar72);
  auVar62 = minps(auVar62,auVar208);
  auVar208 = maxps(auVar142,auVar194);
  fVar96 = (ray->super_RayK<1>).tfar;
  auVar73._4_4_ = fVar96;
  auVar73._0_4_ = fVar96;
  auVar73._8_4_ = fVar96;
  auVar73._12_4_ = fVar96;
  auVar208 = minps(auVar208,auVar73);
  auVar62 = minps(auVar62,auVar208);
  auVar87._0_4_ = -(uint)(PVar3 != (Primitive)0x0 && local_1a8 <= auVar62._0_4_ * 1.0000004);
  auVar87._4_4_ = -(uint)(1 < (byte)PVar3 && fStack_1a4 <= auVar62._4_4_ * 1.0000004);
  auVar87._8_4_ = -(uint)(2 < (byte)PVar3 && fStack_1a0 <= auVar62._8_4_ * 1.0000004);
  auVar87._12_4_ = -(uint)(3 < (byte)PVar3 && fStack_19c <= auVar62._12_4_ * 1.0000004);
  uVar48 = movmskps((int)lVar40,auVar87);
  if (uVar48 == 0) {
    return;
  }
  uVar48 = uVar48 & 0xff;
  local_158._0_12_ = mm_lookupmask_ps._240_12_;
  local_158._12_4_ = 0;
  local_418 = context;
LAB_00b6b727:
  local_2e0 = (ulong)uVar48;
  lVar40 = 0;
  if (local_2e0 != 0) {
    for (; (uVar48 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
    }
  }
  uVar48 = *(uint *)(prim + 2);
  pRVar45 = (RTCIntersectArguments *)(ulong)uVar48;
  pGVar5 = (context->scene->geometries).items[(long)pRVar45].ptr;
  pRVar44 = *(RTCIntersectArguments **)&pGVar5->field_0x58;
  _Var6 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  local_3c0 = (ulong)*(uint *)(prim + lVar40 * 4 + 6);
  uVar46 = (ulong)*(RTCRayQueryFlags *)
                   ((long)&pRVar44->flags + _Var6 * *(uint *)(prim + lVar40 * 4 + 6));
  p_Var7 = pGVar5[1].intersectionFilterN;
  pvVar8 = pGVar5[2].userPtr;
  _Var9 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar2 = (float *)(_Var9 + uVar46 * (long)pvVar8);
  fVar96 = *pfVar2;
  fVar54 = pfVar2[1];
  fVar82 = pfVar2[2];
  fVar83 = pfVar2[3];
  pfVar2 = (float *)(_Var9 + (uVar46 + 1) * (long)pvVar8);
  fVar84 = *pfVar2;
  fVar95 = pfVar2[1];
  fVar97 = pfVar2[2];
  fVar113 = pfVar2[3];
  pfVar2 = (float *)(_Var9 + (uVar46 + 2) * (long)pvVar8);
  fVar114 = *pfVar2;
  fVar116 = pfVar2[1];
  fVar129 = pfVar2[2];
  fVar130 = pfVar2[3];
  pfVar2 = (float *)(_Var9 + (long)pvVar8 * (uVar46 + 3));
  fVar131 = *pfVar2;
  fVar136 = pfVar2[1];
  fVar137 = pfVar2[2];
  fVar138 = pfVar2[3];
  local_2e0 = local_2e0 - 1 & local_2e0;
  lVar40 = *(long *)&pGVar5[1].time_range.upper;
  pfVar2 = (float *)(lVar40 + (long)p_Var7 * uVar46);
  fVar98 = *pfVar2;
  fVar149 = pfVar2[1];
  fVar150 = pfVar2[2];
  fVar115 = pfVar2[3];
  pfVar2 = (float *)(lVar40 + (long)p_Var7 * (uVar46 + 1));
  fVar151 = *pfVar2;
  fVar165 = pfVar2[1];
  fVar166 = pfVar2[2];
  fVar167 = pfVar2[3];
  pfVar2 = (float *)(lVar40 + (long)p_Var7 * (uVar46 + 2));
  fVar188 = *pfVar2;
  fVar189 = pfVar2[1];
  fVar190 = pfVar2[2];
  fVar204 = pfVar2[3];
  lVar10 = 0;
  if (local_2e0 != 0) {
    for (; (local_2e0 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  pfVar2 = (float *)(lVar40 + (long)p_Var7 * (uVar46 + 3));
  fVar205 = *pfVar2;
  fVar206 = pfVar2[1];
  fVar215 = pfVar2[2];
  fVar216 = pfVar2[3];
  if ((local_2e0 != 0) && (uVar46 = local_2e0 - 1 & local_2e0, uVar46 != 0)) {
    lVar40 = 0;
    if (uVar46 != 0) {
      for (; (uVar46 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
      }
    }
    pRVar44 = (RTCIntersectArguments *)
              (ulong)*(RTCRayQueryFlags *)
                      ((long)&pRVar44->flags + _Var6 * *(uint *)(prim + lVar40 * 4 + 6));
  }
  fVar217 = fVar188 * 0.0 + fVar205 * -0.0 + fVar151 + fVar98 * -0.0;
  fVar222 = fVar189 * 0.0 + fVar206 * -0.0 + fVar165 + fVar149 * -0.0;
  fVar223 = fVar190 * 0.0 + fVar215 * -0.0 + fVar166 + fVar150 * -0.0;
  fVar226 = fVar204 * 0.0 + fVar216 * -0.0 + fVar167 + fVar115 * -0.0;
  fVar231 = (fVar188 * 0.5 + fVar205 * 0.0 + fVar151 * 0.0) - fVar98 * 0.5;
  fVar232 = (fVar189 * 0.5 + fVar206 * 0.0 + fVar165 * 0.0) - fVar149 * 0.5;
  fVar233 = (fVar190 * 0.5 + fVar215 * 0.0 + fVar166 * 0.0) - fVar150 * 0.5;
  fVar234 = (fVar204 * 0.5 + fVar216 * 0.0 + fVar167 * 0.0) - fVar115 * 0.5;
  fVar235 = (fVar114 * 0.5 + fVar131 * 0.0 + fVar84 * 0.0) - fVar96 * 0.5;
  fVar241 = (fVar116 * 0.5 + fVar136 * 0.0 + fVar95 * 0.0) - fVar54 * 0.5;
  fVar243 = (fVar129 * 0.5 + fVar137 * 0.0 + fVar97 * 0.0) - fVar82 * 0.5;
  fVar245 = (fVar130 * 0.5 + fVar138 * 0.0 + fVar113 * 0.0) - fVar83 * 0.5;
  fVar250 = fVar114 * 0.0 + fVar131 * -0.0 + fVar84 + fVar96 * -0.0;
  fVar251 = fVar116 * 0.0 + fVar136 * -0.0 + fVar95 + fVar54 * -0.0;
  fVar224 = fVar129 * 0.0 + fVar137 * -0.0 + fVar97 + fVar82 * -0.0;
  fVar225 = fVar130 * 0.0 + fVar138 * -0.0 + fVar113 + fVar83 * -0.0;
  fVar240 = fVar205 * -0.0 + fVar188 + fVar151 * 0.0 + fVar98 * -0.0;
  fVar242 = fVar206 * -0.0 + fVar189 + fVar165 * 0.0 + fVar149 * -0.0;
  fVar244 = fVar215 * -0.0 + fVar190 + fVar166 * 0.0 + fVar150 * -0.0;
  fVar246 = fVar216 * -0.0 + fVar204 + fVar167 * 0.0 + fVar115 * -0.0;
  fVar98 = fVar98 * 0.0 + ((fVar205 * 0.5 + fVar188 * 0.0) - fVar151 * 0.5);
  fVar149 = fVar149 * 0.0 + ((fVar206 * 0.5 + fVar189 * 0.0) - fVar165 * 0.5);
  fVar150 = fVar150 * 0.0 + ((fVar215 * 0.5 + fVar190 * 0.0) - fVar166 * 0.5);
  fVar115 = fVar115 * 0.0 + ((fVar216 * 0.5 + fVar204 * 0.0) - fVar167 * 0.5);
  fVar151 = fVar131 * -0.0 + fVar114 + fVar84 * 0.0 + fVar96 * -0.0;
  fVar165 = fVar136 * -0.0 + fVar116 + fVar95 * 0.0 + fVar54 * -0.0;
  fVar166 = fVar137 * -0.0 + fVar129 + fVar97 * 0.0 + fVar82 * -0.0;
  fVar167 = fVar138 * -0.0 + fVar130 + fVar113 * 0.0 + fVar83 * -0.0;
  fVar96 = fVar96 * 0.0 + ((fVar131 * 0.5 + fVar114 * 0.0) - fVar84 * 0.5);
  fVar54 = fVar54 * 0.0 + ((fVar136 * 0.5 + fVar116 * 0.0) - fVar95 * 0.5);
  fVar82 = fVar82 * 0.0 + ((fVar137 * 0.5 + fVar129 * 0.0) - fVar97 * 0.5);
  fVar83 = fVar83 * 0.0 + ((fVar138 * 0.5 + fVar130 * 0.0) - fVar113 * 0.5);
  fVar188 = fVar232 * fVar250 - fVar251 * fVar231;
  fVar190 = fVar233 * fVar251 - fVar224 * fVar232;
  fVar204 = fVar231 * fVar224 - fVar250 * fVar233;
  fVar205 = fVar234 * fVar225 - fVar225 * fVar234;
  fVar131 = fVar232 * fVar235 - fVar241 * fVar231;
  fVar137 = fVar233 * fVar241 - fVar243 * fVar232;
  fVar138 = fVar231 * fVar243 - fVar235 * fVar233;
  fVar113 = fVar149 * fVar151 - fVar165 * fVar98;
  fVar116 = fVar150 * fVar165 - fVar166 * fVar149;
  fVar129 = fVar98 * fVar166 - fVar151 * fVar150;
  fVar130 = fVar115 * fVar167 - fVar167 * fVar115;
  fVar84 = fVar149 * fVar96 - fVar54 * fVar98;
  fVar54 = fVar150 * fVar54 - fVar82 * fVar149;
  fVar82 = fVar98 * fVar82 - fVar96 * fVar150;
  fVar165 = fVar204 * fVar204 + fVar190 * fVar190 + fVar188 * fVar188;
  auVar208 = ZEXT416((uint)fVar165);
  auVar62 = rsqrtss(ZEXT416((uint)fVar165),auVar208);
  fVar96 = auVar62._0_4_;
  fVar166 = fVar96 * 1.5 - fVar96 * fVar96 * fVar165 * 0.5 * fVar96;
  fVar189 = fVar188 * fVar131 + fVar204 * fVar138 + fVar190 * fVar137;
  fVar96 = fVar205 * fVar166;
  auVar62 = rcpss(auVar208,auVar208);
  fVar136 = (2.0 - fVar165 * auVar62._0_4_) * auVar62._0_4_;
  fVar151 = fVar129 * fVar129 + fVar116 * fVar116 + fVar113 * fVar113;
  auVar62 = ZEXT416((uint)fVar151);
  auVar208 = rsqrtss(ZEXT416((uint)fVar151),auVar62);
  fVar95 = auVar208._0_4_;
  fVar114 = fVar95 * 1.5 - fVar95 * fVar95 * fVar151 * 0.5 * fVar95;
  fVar167 = fVar113 * fVar84 + fVar129 * fVar82 + fVar116 * fVar54;
  fVar97 = fVar130 * fVar114;
  auVar62 = rcpss(auVar62,auVar62);
  fVar95 = (2.0 - fVar151 * auVar62._0_4_) * auVar62._0_4_;
  local_388 = fVar226 * fVar190 * fVar166;
  fStack_384 = fVar226 * fVar204 * fVar166;
  fStack_380 = fVar226 * fVar188 * fVar166;
  fStack_37c = fVar226 * fVar96;
  local_338 = fVar217 - local_388;
  fStack_334 = fVar222 - fStack_384;
  fStack_330 = fVar223 - fStack_380;
  fStack_32c = fVar226 - fStack_37c;
  fVar190 = fVar226 * fVar136 * (fVar165 * fVar137 - fVar189 * fVar190) * fVar166 +
            fVar234 * fVar190 * fVar166;
  fVar204 = fVar226 * fVar136 * (fVar165 * fVar138 - fVar189 * fVar204) * fVar166 +
            fVar234 * fVar204 * fVar166;
  fVar131 = fVar226 * fVar136 * (fVar165 * fVar131 - fVar189 * fVar188) * fVar166 +
            fVar234 * fVar188 * fVar166;
  fVar165 = fVar226 * fVar136 * (fVar165 * (fVar234 * fVar245 - fVar245 * fVar234) -
                                fVar189 * fVar205) * fVar166 + fVar234 * fVar96;
  local_388 = local_388 + fVar217;
  fStack_384 = fStack_384 + fVar222;
  fStack_380 = fStack_380 + fVar223;
  fStack_37c = fStack_37c + fVar226;
  local_398 = fVar246 * fVar116 * fVar114;
  fStack_394 = fVar246 * fVar129 * fVar114;
  fStack_390 = fVar246 * fVar113 * fVar114;
  fStack_38c = fVar246 * fVar97;
  local_358 = fVar240 - local_398;
  fStack_354 = fVar242 - fStack_394;
  fStack_350 = fVar244 - fStack_390;
  fStack_34c = fVar246 - fStack_38c;
  fVar96 = fVar246 * fVar95 * (fVar151 * fVar54 - fVar167 * fVar116) * fVar114 +
           fVar115 * fVar116 * fVar114;
  fVar54 = fVar246 * fVar95 * (fVar151 * fVar82 - fVar167 * fVar129) * fVar114 +
           fVar115 * fVar129 * fVar114;
  fVar82 = fVar246 * fVar95 * (fVar151 * fVar84 - fVar167 * fVar113) * fVar114 +
           fVar115 * fVar113 * fVar114;
  fVar83 = fVar246 * fVar95 * (fVar151 * (fVar115 * fVar83 - fVar83 * fVar115) - fVar167 * fVar130)
                     * fVar114 + fVar115 * fVar97;
  local_398 = local_398 + fVar240;
  fStack_394 = fStack_394 + fVar242;
  fStack_390 = fStack_390 + fVar244;
  fStack_38c = fStack_38c + fVar246;
  local_348 = (fVar231 - fVar190) * 0.33333334 + local_338;
  fStack_344 = (fVar232 - fVar204) * 0.33333334 + fStack_334;
  fStack_340 = (fVar233 - fVar131) * 0.33333334 + fStack_330;
  fStack_33c = (fVar234 - fVar165) * 0.33333334 + fStack_32c;
  local_368 = local_358 - (fVar98 - fVar96) * 0.33333334;
  fStack_364 = fStack_354 - (fVar149 - fVar54) * 0.33333334;
  fStack_360 = fStack_350 - (fVar150 - fVar82) * 0.33333334;
  fStack_35c = fStack_34c - (fVar115 - fVar83) * 0.33333334;
  local_3a8 = local_398 - (fVar96 + fVar98) * 0.33333334;
  fStack_3a4 = fStack_394 - (fVar54 + fVar149) * 0.33333334;
  fStack_3a0 = fStack_390 - (fVar82 + fVar150) * 0.33333334;
  fStack_39c = fStack_38c - (fVar83 + fVar115) * 0.33333334;
  fVar96 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar54 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar82 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar83 = (pre->ray_space).vx.field_0.m128[0];
  fVar84 = (pre->ray_space).vx.field_0.m128[1];
  fVar95 = (pre->ray_space).vy.field_0.m128[0];
  fVar97 = (pre->ray_space).vy.field_0.m128[1];
  fVar113 = (pre->ray_space).vz.field_0.m128[0];
  fVar114 = (pre->ray_space).vz.field_0.m128[1];
  fVar166 = (local_338 - fVar96) * fVar83 +
            (fStack_334 - fVar54) * fVar95 + (fStack_330 - fVar82) * fVar113;
  fVar167 = (local_338 - fVar96) * fVar84 +
            (fStack_334 - fVar54) * fVar97 + (fStack_330 - fVar82) * fVar114;
  local_1f8 = CONCAT44(fVar167,fVar166);
  fVar149 = (local_348 - fVar96) * fVar83 +
            (fStack_344 - fVar54) * fVar95 + (fStack_340 - fVar82) * fVar113;
  fVar150 = (local_348 - fVar96) * fVar84 +
            (fStack_344 - fVar54) * fVar97 + (fStack_340 - fVar82) * fVar114;
  local_208 = CONCAT44(fVar150,fVar149);
  fVar115 = (local_368 - fVar96) * fVar83 +
            (fStack_364 - fVar54) * fVar95 + (fStack_360 - fVar82) * fVar113;
  fVar151 = (local_368 - fVar96) * fVar84 +
            (fStack_364 - fVar54) * fVar97 + (fStack_360 - fVar82) * fVar114;
  local_218 = CONCAT44(fVar151,fVar115);
  fVar138 = (local_358 - fVar96) * fVar83 +
            (fStack_354 - fVar54) * fVar95 + (fStack_350 - fVar82) * fVar113;
  fVar98 = (local_358 - fVar96) * fVar84 +
           (fStack_354 - fVar54) * fVar97 + (fStack_350 - fVar82) * fVar114;
  local_228 = CONCAT44(fVar98,fVar138);
  fVar136 = (local_388 - fVar96) * fVar83 +
            (fStack_384 - fVar54) * fVar95 + (fStack_380 - fVar82) * fVar113;
  fVar137 = (local_388 - fVar96) * fVar84 +
            (fStack_384 - fVar54) * fVar97 + (fStack_380 - fVar82) * fVar114;
  local_238 = CONCAT44(fVar137,fVar136);
  local_2a8 = (fVar190 + fVar231) * 0.33333334 + local_388;
  fStack_2a4 = (fVar204 + fVar232) * 0.33333334 + fStack_384;
  fStack_2a0 = (fVar131 + fVar233) * 0.33333334 + fStack_380;
  fStack_29c = (fVar165 + fVar234) * 0.33333334 + fStack_37c;
  fVar130 = (local_2a8 - fVar96) * fVar83 +
            (fStack_2a4 - fVar54) * fVar95 + (fStack_2a0 - fVar82) * fVar113;
  fVar131 = (local_2a8 - fVar96) * fVar84 +
            (fStack_2a4 - fVar54) * fVar97 + (fStack_2a0 - fVar82) * fVar114;
  local_248 = CONCAT44(fVar131,fVar130);
  fVar116 = (local_3a8 - fVar96) * fVar83 +
            (fStack_3a4 - fVar54) * fVar95 + (fStack_3a0 - fVar82) * fVar113;
  fVar129 = (local_3a8 - fVar96) * fVar84 +
            (fStack_3a4 - fVar54) * fVar97 + (fStack_3a0 - fVar82) * fVar114;
  local_258 = CONCAT44(fVar129,fVar116);
  fVar83 = (local_398 - fVar96) * fVar83 +
           (fStack_394 - fVar54) * fVar95 + (fStack_390 - fVar82) * fVar113;
  fVar96 = (local_398 - fVar96) * fVar84 +
           (fStack_394 - fVar54) * fVar97 + (fStack_390 - fVar82) * fVar114;
  local_268 = CONCAT44(fVar96,fVar83);
  register0x00001308 = local_248;
  local_318 = local_208;
  register0x00001408 = local_268;
  local_3d8 = local_228;
  auVar74._8_4_ = fVar136;
  auVar74._0_8_ = local_1f8;
  auVar74._12_4_ = fVar137;
  auVar62 = minps(auVar74,_local_318);
  auVar88._8_4_ = fVar116;
  auVar88._0_8_ = local_218;
  auVar88._12_4_ = fVar129;
  auVar208 = minps(auVar88,_local_3d8);
  auVar62 = minps(auVar62,auVar208);
  auVar89._4_4_ = fVar167;
  auVar89._0_4_ = fVar166;
  auVar89._8_4_ = fVar136;
  auVar89._12_4_ = fVar137;
  auVar208 = maxps(auVar89,_local_318);
  auVar99._4_4_ = fVar151;
  auVar99._0_4_ = fVar115;
  auVar99._8_4_ = fVar116;
  auVar99._12_4_ = fVar129;
  auVar100 = maxps(auVar99,_local_3d8);
  auVar90 = maxps(auVar208,auVar100);
  auVar11._4_8_ = auVar100._8_8_;
  auVar11._0_4_ = auVar62._4_4_;
  auVar101._0_8_ = auVar11._0_8_ << 0x20;
  auVar101._8_4_ = auVar62._8_4_;
  auVar101._12_4_ = auVar62._12_4_;
  auVar102._8_8_ = auVar62._8_8_;
  auVar102._0_8_ = auVar101._8_8_;
  auVar208 = minps(auVar62,auVar102);
  auVar12._4_8_ = auVar62._8_8_;
  auVar12._0_4_ = auVar90._4_4_;
  auVar103._0_8_ = auVar12._0_8_ << 0x20;
  auVar103._8_4_ = auVar90._8_4_;
  auVar103._12_4_ = auVar90._12_4_;
  auVar104._8_8_ = auVar90._8_8_;
  auVar104._0_8_ = auVar103._8_8_;
  auVar62 = maxps(auVar90,auVar104);
  auVar75._0_8_ = auVar208._0_8_ & 0x7fffffff7fffffff;
  auVar75._8_4_ = auVar208._8_4_ & 0x7fffffff;
  auVar75._12_4_ = auVar208._12_4_ & 0x7fffffff;
  auVar91._0_8_ = auVar62._0_8_ & 0x7fffffff7fffffff;
  auVar91._8_4_ = auVar62._8_4_ & 0x7fffffff;
  auVar91._12_4_ = auVar62._12_4_ & 0x7fffffff;
  auVar62 = maxps(auVar75,auVar91);
  fStack_2f4 = auVar62._4_4_;
  local_2f8 = fStack_2f4;
  if (fStack_2f4 <= auVar62._0_4_) {
    local_2f8 = auVar62._0_4_;
  }
  local_2f8 = local_2f8 * 9.536743e-07;
  uStack_1f0 = local_1f8;
  uStack_200 = local_208;
  uStack_210 = local_218;
  uStack_220 = local_228;
  uStack_230 = local_238;
  uStack_240 = local_248;
  uStack_250 = local_258;
  uStack_260 = local_268;
  fStack_2f0 = fStack_2f4;
  fStack_2ec = fStack_2f4;
  local_138 = local_2f8;
  fStack_134 = local_2f8;
  fStack_130 = local_2f8;
  fStack_12c = local_2f8;
  local_148 = -local_2f8;
  fStack_144 = -local_2f8;
  fStack_140 = -local_2f8;
  fStack_13c = -local_2f8;
  local_88 = fVar149 - fVar166;
  fStack_84 = fVar150 - fVar167;
  fStack_80 = fVar130 - fVar136;
  fStack_7c = fVar131 - fVar137;
  local_98 = fVar115 - fVar149;
  fStack_94 = fVar151 - fVar150;
  fStack_90 = fVar116 - fVar130;
  fStack_8c = fVar129 - fVar131;
  local_a8 = fVar138 - fVar115;
  fStack_a4 = fVar98 - fVar151;
  fStack_a0 = fVar83 - fVar116;
  fStack_9c = fVar96 - fVar129;
  local_168 = local_388 - local_338;
  fStack_164 = fStack_384 - fStack_334;
  fStack_160 = fStack_380 - fStack_330;
  fStack_15c = fStack_37c - fStack_32c;
  local_178 = local_2a8 - local_348;
  fStack_174 = fStack_2a4 - fStack_344;
  fStack_170 = fStack_2a0 - fStack_340;
  fStack_16c = fStack_29c - fStack_33c;
  local_188 = local_3a8 - local_368;
  fStack_184 = fStack_3a4 - fStack_364;
  fStack_180 = fStack_3a0 - fStack_360;
  fStack_17c = fStack_39c - fStack_35c;
  local_198 = local_398 - local_358;
  fStack_194 = fStack_394 - fStack_354;
  fStack_190 = fStack_390 - fStack_350;
  fStack_18c = fStack_38c - fStack_34c;
  uVar46 = 0;
  stack0xfffffffffffffc08 = 0x3f80000000000000;
  uStack_3f0 = 0;
  _local_3e8 = 0x3f80000000000000;
  uStack_3e0 = 0;
  local_308 = local_1f8;
  uStack_300 = local_238;
  local_328 = local_218;
  uStack_320 = local_258;
  context = local_418;
  do {
    fVar96 = 1.0 - (float)local_3fc._4_4_;
    fVar54 = 1.0 - (float)local_3fc._4_4_;
    fVar82 = 1.0 - fStack_3f4;
    fVar83 = 1.0 - fStack_3f4;
    fVar84 = (float)local_1f8 * fVar96 + (float)local_238 * (float)local_3fc._4_4_;
    fVar131 = local_1f8._4_4_ * fVar54 + local_238._4_4_ * (float)local_3fc._4_4_;
    fVar136 = (float)uStack_1f0 * fVar82 + (float)uStack_230 * fStack_3f4;
    fVar137 = uStack_1f0._4_4_ * fVar83 + uStack_230._4_4_ * fStack_3f4;
    fVar116 = (float)local_208 * fVar96 + (float)local_248 * (float)local_3fc._4_4_;
    fVar115 = local_208._4_4_ * fVar54 + local_248._4_4_ * (float)local_3fc._4_4_;
    fVar151 = (float)uStack_200 * fVar82 + (float)uStack_240 * fStack_3f4;
    fVar165 = uStack_200._4_4_ * fVar83 + uStack_240._4_4_ * fStack_3f4;
    fVar166 = (float)local_218 * fVar96 + (float)local_258 * (float)local_3fc._4_4_;
    fVar167 = local_218._4_4_ * fVar54 + local_258._4_4_ * (float)local_3fc._4_4_;
    fVar188 = (float)uStack_210 * fVar82 + (float)uStack_250 * fStack_3f4;
    fVar189 = uStack_210._4_4_ * fVar83 + uStack_250._4_4_ * fStack_3f4;
    fVar223 = fVar96 * (float)local_228 + (float)local_3fc._4_4_ * (float)local_268;
    fVar226 = fVar54 * local_228._4_4_ + (float)local_3fc._4_4_ * local_268._4_4_;
    fVar231 = fVar82 * (float)uStack_220 + fStack_3f4 * (float)uStack_260;
    fVar232 = fVar83 * uStack_220._4_4_ + fStack_3f4 * uStack_260._4_4_;
    fVar96 = (fStack_3e4 - local_3e8) * 0.11111111;
    fVar190 = (fStack_3e4 - local_3e8) * 0.0 + local_3e8;
    fVar204 = (fStack_3e4 - local_3e8) * 0.33333334 + local_3e8;
    fVar205 = (fStack_3e4 - local_3e8) * 0.6666667 + local_3e8;
    fVar206 = (fStack_3e4 - local_3e8) * 1.0 + local_3e8;
    fVar215 = 1.0 - fVar190;
    fVar216 = 1.0 - fVar204;
    fVar217 = 1.0 - fVar205;
    fVar222 = 1.0 - fVar206;
    fVar95 = fVar116 * fVar215 + fVar166 * fVar190;
    fVar97 = fVar116 * fVar216 + fVar166 * fVar204;
    fVar113 = fVar116 * fVar217 + fVar166 * fVar205;
    fVar114 = fVar116 * fVar222 + fVar166 * fVar206;
    fVar138 = fVar115 * fVar215 + fVar167 * fVar190;
    fVar98 = fVar115 * fVar216 + fVar167 * fVar204;
    fVar149 = fVar115 * fVar217 + fVar167 * fVar205;
    fVar150 = fVar115 * fVar222 + fVar167 * fVar206;
    fVar54 = (fVar84 * fVar215 + fVar116 * fVar190) * fVar215 + fVar190 * fVar95;
    fVar82 = (fVar84 * fVar216 + fVar116 * fVar204) * fVar216 + fVar204 * fVar97;
    fVar83 = (fVar84 * fVar217 + fVar116 * fVar205) * fVar217 + fVar205 * fVar113;
    fVar84 = (fVar84 * fVar222 + fVar116 * fVar206) * fVar222 + fVar206 * fVar114;
    fVar116 = (fVar131 * fVar215 + fVar115 * fVar190) * fVar215 + fVar190 * fVar138;
    fVar129 = (fVar131 * fVar216 + fVar115 * fVar204) * fVar216 + fVar204 * fVar98;
    fVar130 = (fVar131 * fVar217 + fVar115 * fVar205) * fVar217 + fVar205 * fVar149;
    fVar131 = (fVar131 * fVar222 + fVar115 * fVar206) * fVar222 + fVar206 * fVar150;
    fVar95 = fVar95 * fVar215 + (fVar166 * fVar215 + fVar223 * fVar190) * fVar190;
    fVar97 = fVar97 * fVar216 + (fVar166 * fVar216 + fVar223 * fVar204) * fVar204;
    fVar113 = fVar113 * fVar217 + (fVar166 * fVar217 + fVar223 * fVar205) * fVar205;
    fVar114 = fVar114 * fVar222 + (fVar166 * fVar222 + fVar223 * fVar206) * fVar206;
    fVar138 = fVar138 * fVar215 + (fVar167 * fVar215 + fVar226 * fVar190) * fVar190;
    fVar98 = fVar98 * fVar216 + (fVar167 * fVar216 + fVar226 * fVar204) * fVar204;
    fVar149 = fVar149 * fVar217 + (fVar167 * fVar217 + fVar226 * fVar205) * fVar205;
    fVar150 = fVar150 * fVar222 + (fVar167 * fVar222 + fVar226 * fVar206) * fVar206;
    local_298 = fVar215 * fVar54 + fVar190 * fVar95;
    fStack_294 = fVar216 * fVar82 + fVar204 * fVar97;
    fStack_290 = fVar217 * fVar83 + fVar205 * fVar113;
    fStack_28c = fVar222 * fVar84 + fVar206 * fVar114;
    local_288 = fVar215 * fVar116 + fVar190 * fVar138;
    fStack_284 = fVar216 * fVar129 + fVar204 * fVar98;
    fStack_280 = fVar217 * fVar130 + fVar205 * fVar149;
    fStack_27c = fVar222 * fVar131 + fVar206 * fVar150;
    fVar97 = (fVar97 - fVar82) * 3.0 * fVar96;
    fVar83 = (fVar113 - fVar83) * 3.0 * fVar96;
    fVar84 = (fVar114 - fVar84) * 3.0 * fVar96;
    fVar113 = (fVar98 - fVar129) * 3.0 * fVar96;
    fVar114 = (fVar149 - fVar130) * 3.0 * fVar96;
    fVar129 = (fVar150 - fVar131) * 3.0 * fVar96;
    local_d8._4_4_ = fStack_290;
    local_d8._0_4_ = fStack_294;
    local_b8._4_4_ = fStack_280;
    local_b8._0_4_ = fStack_284;
    local_378._0_4_ = local_298 + (fVar95 - fVar54) * 3.0 * fVar96;
    local_378._4_4_ = fStack_294 + fVar97;
    fStack_370 = fStack_290 + fVar83;
    fStack_36c = fStack_28c + fVar84;
    fVar54 = local_288 + (fVar138 - fVar116) * 3.0 * fVar96;
    fVar82 = fStack_284 + fVar113;
    fStack_420 = fStack_280 + fVar114;
    fStack_41c = fStack_27c + fVar129;
    local_278._0_4_ = fStack_294 - fVar97;
    local_278._4_4_ = fStack_290 - fVar83;
    local_278._8_4_ = fStack_28c - fVar84;
    local_278._12_4_ = 0;
    local_b8._8_4_ = fStack_27c;
    local_b8._12_4_ = 0;
    local_c8._0_4_ = fStack_284 - fVar113;
    local_c8._4_4_ = fStack_280 - fVar114;
    local_c8._8_4_ = fStack_27c - fVar129;
    local_c8._12_4_ = 0;
    fVar83 = fVar151 * fVar215 + fVar188 * fVar190;
    fVar84 = fVar151 * fVar216 + fVar188 * fVar204;
    fVar95 = fVar151 * fVar217 + fVar188 * fVar205;
    fVar97 = fVar151 * fVar222 + fVar188 * fVar206;
    fVar113 = fVar165 * fVar215 + fVar189 * fVar190;
    fVar114 = fVar165 * fVar216 + fVar189 * fVar204;
    fVar116 = fVar165 * fVar217 + fVar189 * fVar205;
    fVar129 = fVar165 * fVar222 + fVar189 * fVar206;
    fVar138 = (fVar136 * fVar215 + fVar151 * fVar190) * fVar215 + fVar190 * fVar83;
    fVar98 = (fVar136 * fVar216 + fVar151 * fVar204) * fVar216 + fVar204 * fVar84;
    fVar149 = (fVar136 * fVar217 + fVar151 * fVar205) * fVar217 + fVar205 * fVar95;
    fVar150 = (fVar136 * fVar222 + fVar151 * fVar206) * fVar222 + fVar206 * fVar97;
    fVar130 = (fVar137 * fVar215 + fVar165 * fVar190) * fVar215 + fVar190 * fVar113;
    fVar131 = (fVar137 * fVar216 + fVar165 * fVar204) * fVar216 + fVar204 * fVar114;
    fVar136 = (fVar137 * fVar217 + fVar165 * fVar205) * fVar217 + fVar205 * fVar116;
    fVar137 = (fVar137 * fVar222 + fVar165 * fVar206) * fVar222 + fVar206 * fVar129;
    fVar83 = fVar83 * fVar215 + (fVar188 * fVar215 + fVar231 * fVar190) * fVar190;
    fVar84 = fVar84 * fVar216 + (fVar188 * fVar216 + fVar231 * fVar204) * fVar204;
    fVar95 = fVar95 * fVar217 + (fVar188 * fVar217 + fVar231 * fVar205) * fVar205;
    fVar97 = fVar97 * fVar222 + (fVar188 * fVar222 + fVar231 * fVar206) * fVar206;
    fVar115 = fVar113 * fVar215 + (fVar189 * fVar215 + fVar232 * fVar190) * fVar190;
    fVar151 = fVar114 * fVar216 + (fVar189 * fVar216 + fVar232 * fVar204) * fVar204;
    fVar165 = fVar116 * fVar217 + (fVar189 * fVar217 + fVar232 * fVar205) * fVar205;
    fVar166 = fVar129 * fVar222 + (fVar189 * fVar222 + fVar232 * fVar206) * fVar206;
    fVar113 = fVar215 * fVar138 + fVar190 * fVar83;
    fVar114 = fVar216 * fVar98 + fVar204 * fVar84;
    fVar116 = fVar217 * fVar149 + fVar205 * fVar95;
    fVar129 = fVar222 * fVar150 + fVar206 * fVar97;
    fVar167 = fVar215 * fVar130 + fVar190 * fVar115;
    fVar188 = fVar216 * fVar131 + fVar204 * fVar151;
    fVar189 = fVar217 * fVar136 + fVar205 * fVar165;
    fVar190 = fVar222 * fVar137 + fVar206 * fVar166;
    fVar84 = (fVar84 - fVar98) * 3.0 * fVar96;
    fVar95 = (fVar95 - fVar149) * 3.0 * fVar96;
    fVar97 = (fVar97 - fVar150) * 3.0 * fVar96;
    fVar131 = (fVar151 - fVar131) * 3.0 * fVar96;
    fVar136 = (fVar165 - fVar136) * 3.0 * fVar96;
    fVar137 = (fVar166 - fVar137) * 3.0 * fVar96;
    local_e8._4_4_ = fVar116;
    local_e8._0_4_ = fVar114;
    local_e8._8_4_ = fVar129;
    local_e8._12_4_ = 0;
    local_108._4_4_ = fVar189;
    local_108._0_4_ = fVar188;
    local_108._8_4_ = fVar190;
    local_108._12_4_ = 0;
    local_3b8 = fVar113 + (fVar83 - fVar138) * 3.0 * fVar96;
    fStack_3b4 = fVar114 + fVar84;
    auStack_3b0[0] = (uint)(fVar116 + fVar95);
    auStack_3ac[0] = (uint)(fVar129 + fVar97);
    local_f8 = fVar167 + (fVar115 - fVar130) * 3.0 * fVar96;
    fStack_f4 = fVar188 + fVar131;
    fStack_f0 = fVar189 + fVar136;
    fStack_ec = fVar190 + fVar137;
    local_128._0_4_ = fVar114 - fVar84;
    local_128._4_4_ = fVar116 - fVar95;
    local_128._8_4_ = fVar129 - fVar97;
    local_128._12_4_ = 0;
    local_118._0_4_ = fVar188 - fVar131;
    local_118._4_4_ = fVar189 - fVar136;
    local_118._8_4_ = fVar190 - fVar137;
    local_118._12_4_ = 0;
    local_d8._8_4_ = fStack_28c;
    local_d8._12_4_ = 0;
    fVar97 = (fVar114 - fStack_294) + (fVar113 - local_298);
    fVar130 = (fVar116 - fStack_290) + (fVar114 - fStack_294);
    fVar131 = (fVar129 - fStack_28c) + (fVar116 - fStack_290);
    fVar136 = (fVar129 - fStack_28c) + 0.0;
    fVar96 = (fVar188 - fStack_284) + (fVar167 - local_288);
    fVar83 = (fVar189 - fStack_280) + (fVar188 - fStack_284);
    fVar84 = (fVar190 - fStack_27c) + (fVar189 - fStack_280);
    fVar95 = (fVar190 - fStack_27c) + 0.0;
    auVar143._0_8_ =
         CONCAT44(fStack_284 * fVar130 - fStack_294 * fVar83,local_288 * fVar97 - local_298 * fVar96
                 );
    auVar143._8_4_ = fStack_280 * fVar131 - fStack_290 * fVar84;
    auVar143._12_4_ = fStack_27c * fVar136 - fStack_28c * fVar95;
    auVar105._0_4_ = fVar54 * fVar97 - (float)local_378._0_4_ * fVar96;
    auVar105._4_4_ = fVar82 * fVar130 - (float)local_378._4_4_ * fVar83;
    auVar105._8_4_ = fStack_420 * fVar131 - fStack_370 * fVar84;
    auVar105._12_4_ = fStack_41c * fVar136 - fStack_36c * fVar95;
    auVar119._0_8_ =
         CONCAT44(local_c8._4_4_ * fVar130 - fVar83 * local_278._4_4_,
                  local_c8._0_4_ * fVar97 - fVar96 * local_278._0_4_);
    auVar119._8_4_ = local_c8._8_4_ * fVar131 - fVar84 * local_278._8_4_;
    auVar119._12_4_ = fVar136 * 0.0 - fVar95 * 0.0;
    auVar259._0_4_ = fVar97 * fStack_284 - fVar96 * fStack_294;
    auVar259._4_4_ = fVar130 * fStack_280 - fVar83 * fStack_290;
    auVar259._8_4_ = fVar131 * fStack_27c - fVar84 * fStack_28c;
    auVar259._12_4_ = fVar136 * 0.0 - fVar95 * 0.0;
    auVar76._0_8_ =
         CONCAT44(fVar188 * fVar130 - fVar114 * fVar83,fVar167 * fVar97 - fVar113 * fVar96);
    auVar76._8_4_ = fVar189 * fVar131 - fVar116 * fVar84;
    auVar76._12_4_ = fVar190 * fVar136 - fVar129 * fVar95;
    auVar228._0_4_ = local_f8 * fVar97 - local_3b8 * fVar96;
    auVar228._4_4_ = fStack_f4 * fVar130 - fStack_3b4 * fVar83;
    auVar228._8_4_ = fStack_f0 * fVar131 - (float)auStack_3b0[0] * fVar84;
    auVar228._12_4_ = fStack_ec * fVar136 - (float)auStack_3ac[0] * fVar95;
    auVar195._0_8_ =
         CONCAT44(local_118._4_4_ * fVar130 - fVar83 * local_128._4_4_,
                  local_118._0_4_ * fVar97 - fVar96 * local_128._0_4_);
    auVar195._8_4_ = local_118._8_4_ * fVar131 - fVar84 * local_128._8_4_;
    auVar195._12_4_ = fVar136 * 0.0 - fVar95 * 0.0;
    auVar218._0_4_ = fVar97 * fVar188 - fVar96 * fVar114;
    auVar218._4_4_ = fVar130 * fVar189 - fVar83 * fVar116;
    auVar218._8_4_ = fVar131 * fVar190 - fVar84 * fVar129;
    auVar218._12_4_ = fVar136 * 0.0 - fVar95 * 0.0;
    auVar252._8_4_ = auVar143._8_4_;
    auVar252._0_8_ = auVar143._0_8_;
    auVar252._12_4_ = auVar143._12_4_;
    auVar90 = minps(auVar252,auVar105);
    auVar208 = maxps(auVar143,auVar105);
    auVar106._8_4_ = auVar119._8_4_;
    auVar106._0_8_ = auVar119._0_8_;
    auVar106._12_4_ = auVar119._12_4_;
    auVar62 = minps(auVar106,auVar259);
    auVar253 = minps(auVar90,auVar62);
    auVar62 = maxps(auVar119,auVar259);
    auVar100 = maxps(auVar208,auVar62);
    auVar107._8_4_ = auVar76._8_4_;
    auVar107._0_8_ = auVar76._0_8_;
    auVar107._12_4_ = auVar76._12_4_;
    auVar208 = minps(auVar107,auVar228);
    auVar62 = maxps(auVar76,auVar228);
    auVar120._8_4_ = auVar195._8_4_;
    auVar120._0_8_ = auVar195._0_8_;
    auVar120._12_4_ = auVar195._12_4_;
    auVar90 = minps(auVar120,auVar218);
    auVar208 = minps(auVar208,auVar90);
    auVar90 = minps(auVar253,auVar208);
    auVar208 = maxps(auVar195,auVar218);
    auVar62 = maxps(auVar62,auVar208);
    auVar62 = maxps(auVar100,auVar62);
    auVar144._0_4_ =
         -(uint)(local_148 <= auVar62._0_4_ && auVar90._0_4_ <= local_138) & local_158._0_4_;
    auVar144._4_4_ =
         -(uint)(fStack_144 <= auVar62._4_4_ && auVar90._4_4_ <= fStack_134) & local_158._4_4_;
    auVar144._8_4_ =
         -(uint)(fStack_140 <= auVar62._8_4_ && auVar90._8_4_ <= fStack_130) & local_158._8_4_;
    auVar144._12_4_ =
         -(uint)(fStack_13c <= auVar62._12_4_ && auVar90._12_4_ <= fStack_12c) & local_158._12_4_;
    iVar42 = movmskps((int)pRVar44,auVar144);
    local_2d8.ray = (RTCRayN *)0x0;
    if (iVar42 != 0) {
      fVar97 = (fVar114 - fVar113) + (fStack_294 - local_298);
      fVar130 = (fVar116 - fVar114) + (fStack_290 - fStack_294);
      fVar131 = (fVar129 - fVar116) + (fStack_28c - fStack_290);
      fVar136 = (0.0 - fVar129) + (0.0 - fStack_28c);
      fVar96 = (fVar188 - fVar167) + (fStack_284 - local_288);
      fVar83 = (fVar189 - fVar188) + (fStack_280 - fStack_284);
      fVar84 = (fVar190 - fVar189) + (fStack_27c - fStack_280);
      fVar95 = (0.0 - fVar190) + (0.0 - fStack_27c);
      auVar257._0_8_ =
           CONCAT44(fStack_284 * fVar130 - fStack_294 * fVar83,
                    local_288 * fVar97 - local_298 * fVar96);
      auVar257._8_4_ = fStack_280 * fVar131 - fStack_290 * fVar84;
      auVar257._12_4_ = fStack_27c * fVar136 - fStack_28c * fVar95;
      auVar108._0_4_ = fVar54 * fVar97 - (float)local_378._0_4_ * fVar96;
      auVar108._4_4_ = fVar82 * fVar130 - (float)local_378._4_4_ * fVar83;
      auVar108._8_4_ = fStack_420 * fVar131 - fStack_370 * fVar84;
      auVar108._12_4_ = fStack_41c * fVar136 - fStack_36c * fVar95;
      auVar185._0_8_ =
           CONCAT44(local_c8._4_4_ * fVar130 - local_278._4_4_ * fVar83,
                    local_c8._0_4_ * fVar97 - local_278._0_4_ * fVar96);
      auVar185._8_4_ = local_c8._8_4_ * fVar131 - local_278._8_4_ * fVar84;
      auVar185._12_4_ = fVar136 * 0.0 - fVar95 * 0.0;
      auVar121._0_4_ = fStack_284 * fVar97 - fStack_294 * fVar96;
      auVar121._4_4_ = fStack_280 * fVar130 - fStack_290 * fVar83;
      auVar121._8_4_ = fStack_27c * fVar131 - fStack_28c * fVar84;
      auVar121._12_4_ = fVar136 * 0.0 - fVar95 * 0.0;
      auVar247._0_8_ =
           CONCAT44(fVar188 * fVar130 - fVar114 * fVar83,fVar167 * fVar97 - fVar113 * fVar96);
      auVar247._8_4_ = fVar189 * fVar131 - fVar116 * fVar84;
      auVar247._12_4_ = fVar190 * fVar136 - fVar129 * fVar95;
      auVar134._0_4_ = local_f8 * fVar97 - local_3b8 * fVar96;
      auVar134._4_4_ = fStack_f4 * fVar130 - fStack_3b4 * fVar83;
      auVar134._8_4_ = fStack_f0 * fVar131 - (float)auStack_3b0[0] * fVar84;
      auVar134._12_4_ = fStack_ec * fVar136 - (float)auStack_3ac[0] * fVar95;
      auVar229._0_8_ =
           CONCAT44(local_118._4_4_ * fVar130 - local_128._4_4_ * fVar83,
                    local_118._0_4_ * fVar97 - local_128._0_4_ * fVar96);
      auVar229._8_4_ = local_118._8_4_ * fVar131 - local_128._8_4_ * fVar84;
      auVar229._12_4_ = fVar136 * 0.0 - fVar95 * 0.0;
      auVar219._0_4_ = fVar97 * fVar188 - fVar96 * fVar114;
      auVar219._4_4_ = fVar130 * fVar189 - fVar83 * fVar116;
      auVar219._8_4_ = fVar131 * fVar190 - fVar84 * fVar129;
      auVar219._12_4_ = fVar136 * 0.0 - fVar95 * 0.0;
      auVar77._8_4_ = auVar257._8_4_;
      auVar77._0_8_ = auVar257._0_8_;
      auVar77._12_4_ = auVar257._12_4_;
      auVar62 = minps(auVar77,auVar108);
      auVar90 = maxps(auVar257,auVar108);
      auVar109._8_4_ = auVar185._8_4_;
      auVar109._0_8_ = auVar185._0_8_;
      auVar109._12_4_ = auVar185._12_4_;
      auVar208 = minps(auVar109,auVar121);
      auVar62 = minps(auVar62,auVar208);
      auVar208 = maxps(auVar185,auVar121);
      auVar253 = maxps(auVar90,auVar208);
      auVar110._8_4_ = auVar247._8_4_;
      auVar110._0_8_ = auVar247._0_8_;
      auVar110._12_4_ = auVar247._12_4_;
      auVar208 = minps(auVar110,auVar134);
      auVar100 = maxps(auVar247,auVar134);
      auVar122._8_4_ = auVar229._8_4_;
      auVar122._0_8_ = auVar229._0_8_;
      auVar122._12_4_ = auVar229._12_4_;
      auVar90 = minps(auVar122,auVar219);
      auVar208 = minps(auVar208,auVar90);
      auVar62 = minps(auVar62,auVar208);
      auVar208 = maxps(auVar229,auVar219);
      auVar208 = maxps(auVar100,auVar208);
      auVar208 = maxps(auVar253,auVar208);
      auVar259._0_4_ =
           (float)(-(uint)(local_148 <= auVar208._0_4_ && auVar62._0_4_ <= local_138) &
                  auVar144._0_4_);
      auVar259._4_4_ =
           (float)(-(uint)(fStack_144 <= auVar208._4_4_ && auVar62._4_4_ <= fStack_134) &
                  auVar144._4_4_);
      auVar259._8_4_ =
           (float)(-(uint)(fStack_140 <= auVar208._8_4_ && auVar62._8_4_ <= fStack_130) &
                  auVar144._8_4_);
      auVar259._12_4_ =
           (float)(-(uint)(fStack_13c <= auVar208._12_4_ && auVar62._12_4_ <= fStack_12c) &
                  auVar144._12_4_);
      uVar49 = movmskps(0,auVar259);
      local_2d8.ray = (RTCRayN *)(ulong)uVar49;
    }
    if ((uint)local_2d8.ray != 0) {
      auStack_1e8[uVar46] = (uint)local_2d8.ray;
      *(undefined8 *)(afStack_78 + uVar46 * 2) = _local_3e8;
      auStack_58[uVar46] = stack0xfffffffffffffc08;
      uVar46 = (ulong)((int)uVar46 + 1);
    }
    do {
      if ((int)uVar46 == 0) {
        fVar96 = (ray->super_RayK<1>).tfar;
        auVar94._4_4_ = -(uint)(fStack_1a4 <= fVar96);
        auVar94._0_4_ = -(uint)(local_1a8 <= fVar96);
        auVar94._8_4_ = -(uint)(fStack_1a0 <= fVar96);
        auVar94._12_4_ = -(uint)(fStack_19c <= fVar96);
        uVar48 = movmskps((int)local_2d8.ray,auVar94);
        uVar48 = (uint)local_2e0 & uVar48;
        if (uVar48 == 0) {
          return;
        }
        goto LAB_00b6b727;
      }
      uVar51 = (int)uVar46 - 1;
      uVar41 = (ulong)uVar51;
      uVar49 = auStack_1e8[uVar41];
      unique0x00006b80 = auStack_58[uVar41];
      uVar39 = 0;
      if (uVar49 != 0) {
        for (; (uVar49 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
        }
      }
      uVar49 = uVar49 - 1 & uVar49;
      auStack_1e8[uVar41] = uVar49;
      if (uVar49 == 0) {
        uVar46 = (ulong)uVar51;
      }
      pRVar43 = (RTCIntersectArguments *)(uVar39 + 1);
      pRVar44 = pRVar43;
      if ((long)pRVar43 < 0) {
        pRVar44 = (RTCIntersectArguments *)((ulong)((uint)pRVar43 & 1) | (ulong)pRVar43 >> 1);
      }
      fVar96 = afStack_78[uVar41 * 2];
      fVar54 = *(float *)((long)auStack_58 + uVar41 * 8 + -0x1c);
      local_3e8 = fVar96 * (1.0 - (float)uVar39 * 0.33333334) + fVar54 * (float)uVar39 * 0.33333334;
      fStack_3e4 = fVar96 * (1.0 - (float)pRVar43 * 0.33333334) +
                   fVar54 * (float)pRVar43 * 0.33333334;
      uStack_3e0._0_4_ = fVar96 * 0.0 + fVar54 * 0.0;
      uStack_3e0._4_4_ = fVar96 * 0.0 + fVar54 * 0.0;
      fVar96 = fStack_3e4 - local_3e8;
      uStack_3f0 = 0;
      if (0.16666667 <= fVar96) break;
      fVar116 = (float)unique0x00006b80;
      fVar130 = (float)((ulong)unique0x00006b80 >> 0x20);
      fVar54 = 1.0 - fVar116;
      fVar82 = 1.0 - fVar116;
      fVar83 = 1.0 - fVar130;
      fVar84 = 1.0 - fVar130;
      fVar95 = (float)local_1f8 * fVar54 + (float)local_238 * fVar116;
      fVar97 = local_1f8._4_4_ * fVar82 + local_238._4_4_ * fVar116;
      fVar113 = (float)uStack_1f0 * fVar83 + (float)uStack_230 * fVar130;
      fVar114 = uStack_1f0._4_4_ * fVar84 + uStack_230._4_4_ * fVar130;
      fVar138 = (float)local_208 * fVar54 + (float)local_248 * fVar116;
      fVar98 = local_208._4_4_ * fVar82 + local_248._4_4_ * fVar116;
      fVar149 = (float)uStack_200 * fVar83 + (float)uStack_240 * fVar130;
      fVar150 = uStack_200._4_4_ * fVar84 + uStack_240._4_4_ * fVar130;
      fVar115 = (float)local_218 * fVar54 + (float)local_258 * fVar116;
      fVar165 = local_218._4_4_ * fVar82 + local_258._4_4_ * fVar116;
      fVar167 = (float)uStack_210 * fVar83 + (float)uStack_250 * fVar130;
      fVar189 = uStack_210._4_4_ * fVar84 + uStack_250._4_4_ * fVar130;
      fVar129 = (fVar54 * (float)local_228 + fVar116 * (float)local_268) - fVar115;
      fVar131 = (fVar82 * local_228._4_4_ + fVar116 * local_268._4_4_) - fVar165;
      fVar136 = (fVar83 * (float)uStack_220 + fVar130 * (float)uStack_260) - fVar167;
      fVar137 = (fVar84 * uStack_220._4_4_ + fVar130 * uStack_260._4_4_) - fVar189;
      fVar54 = local_3e8 * (fVar115 - fVar138) + fVar138;
      fVar82 = local_3e8 * (fVar165 - fVar98) + fVar98;
      fVar83 = local_3e8 * (fVar167 - fVar149) + fVar149;
      fVar84 = local_3e8 * (fVar189 - fVar150) + fVar150;
      fVar151 = (fVar115 - fVar138) * fStack_3e4 + fVar138;
      fVar166 = (fVar165 - fVar98) * fStack_3e4 + fVar98;
      fVar188 = (fVar167 - fVar149) * fStack_3e4 + fVar149;
      fVar190 = (fVar189 - fVar150) * fStack_3e4 + fVar150;
      fVar204 = local_3e8 * (fVar138 - fVar95) + fVar95;
      fVar205 = local_3e8 * (fVar98 - fVar97) + fVar97;
      fVar206 = local_3e8 * (fVar149 - fVar113) + fVar113;
      fVar215 = local_3e8 * (fVar150 - fVar114) + fVar114;
      fVar204 = (fVar54 - fVar204) * local_3e8 + fVar204;
      fVar205 = (fVar82 - fVar205) * local_3e8 + fVar205;
      fVar206 = (fVar83 - fVar206) * local_3e8 + fVar206;
      fVar215 = (fVar84 - fVar215) * local_3e8 + fVar215;
      fVar54 = (((local_3e8 * fVar129 + fVar115) - fVar54) * local_3e8 + fVar54) - fVar204;
      fVar82 = (((local_3e8 * fVar131 + fVar165) - fVar82) * local_3e8 + fVar82) - fVar205;
      fVar83 = (((local_3e8 * fVar136 + fVar167) - fVar83) * local_3e8 + fVar83) - fVar206;
      fVar84 = (((local_3e8 * fVar137 + fVar189) - fVar84) * local_3e8 + fVar84) - fVar215;
      auVar78._0_4_ = local_3e8 * fVar54 + fVar204;
      auVar78._4_4_ = local_3e8 * fVar82 + fVar205;
      auVar78._8_4_ = local_3e8 * fVar83 + fVar206;
      auVar78._12_4_ = local_3e8 * fVar84 + fVar215;
      fVar95 = (fVar138 - fVar95) * fStack_3e4 + fVar95;
      fVar97 = (fVar98 - fVar97) * fStack_3e4 + fVar97;
      fVar113 = (fVar149 - fVar113) * fStack_3e4 + fVar113;
      fVar114 = (fVar150 - fVar114) * fStack_3e4 + fVar114;
      fVar95 = (fVar151 - fVar95) * fStack_3e4 + fVar95;
      fVar97 = (fVar166 - fVar97) * fStack_3e4 + fVar97;
      fVar113 = (fVar188 - fVar113) * fStack_3e4 + fVar113;
      fVar114 = (fVar190 - fVar114) * fStack_3e4 + fVar114;
      fVar138 = (((fVar129 * fStack_3e4 + fVar115) - fVar151) * fStack_3e4 + fVar151) - fVar95;
      fVar98 = (((fVar131 * fStack_3e4 + fVar165) - fVar166) * fStack_3e4 + fVar166) - fVar97;
      fVar149 = (((fVar136 * fStack_3e4 + fVar167) - fVar188) * fStack_3e4 + fVar188) - fVar113;
      fVar150 = (((fVar137 * fStack_3e4 + fVar189) - fVar190) * fStack_3e4 + fVar190) - fVar114;
      fVar95 = fStack_3e4 * fVar138 + fVar95;
      fVar97 = fStack_3e4 * fVar98 + fVar97;
      fVar113 = fStack_3e4 * fVar149 + fVar113;
      fVar114 = fStack_3e4 * fVar150 + fVar114;
      fVar115 = fVar96 * 0.33333334;
      fVar129 = fVar54 * 3.0 * fVar115 + auVar78._0_4_;
      fVar131 = fVar82 * 3.0 * fVar115 + auVar78._4_4_;
      fVar136 = fVar83 * 3.0 * fVar115 + auVar78._8_4_;
      fVar137 = fVar84 * 3.0 * fVar115 + auVar78._12_4_;
      fVar138 = fVar95 - fVar115 * fVar138 * 3.0;
      fVar98 = fVar97 - fVar115 * fVar98 * 3.0;
      fVar149 = fVar113 - fVar115 * fVar149 * 3.0;
      fVar150 = fVar114 - fVar115 * fVar150 * 3.0;
      auVar13._4_8_ = auVar259._8_8_;
      auVar13._0_4_ = auVar78._4_4_;
      auVar258._0_8_ = auVar13._0_8_ << 0x20;
      auVar258._8_4_ = auVar78._8_4_;
      auVar258._12_4_ = auVar78._12_4_;
      auVar259._8_8_ = auVar78._8_8_;
      auVar259._0_8_ = auVar258._8_8_;
      fVar166 = (fVar113 - fVar95) + (auVar78._8_4_ - auVar78._0_4_);
      fVar167 = (fVar114 - fVar97) + (auVar78._12_4_ - auVar78._4_4_);
      auVar196._0_4_ = fVar167 * fVar97;
      auVar196._4_4_ = fVar167 * fVar97;
      auVar196._8_4_ = fVar167 * fVar114;
      auVar196._12_4_ = fVar167 * fVar114;
      fVar54 = auVar78._0_4_ * fVar166 + auVar78._4_4_ * fVar167;
      fVar82 = auVar78._8_4_ * fVar166 + auVar78._12_4_ * fVar167;
      fVar188 = fVar129 * fVar166 + fVar131 * fVar167;
      fVar189 = fVar136 * fVar166 + fVar137 * fVar167;
      fVar115 = fVar138 * fVar166 + fVar98 * fVar167;
      auVar209._4_4_ = fVar98 * fVar166 + fVar98 * fVar167;
      auVar209._0_4_ = fVar115;
      fVar151 = fVar149 * fVar166 + fVar150 * fVar167;
      fVar83 = fVar166 * fVar95 + auVar196._0_4_;
      fVar165 = fVar166 * fVar113 + auVar196._8_4_;
      auVar14._4_8_ = auVar196._8_8_;
      auVar14._0_4_ = fVar131 * fVar166 + fVar131 * fVar167;
      auVar197._0_8_ = auVar14._0_8_ << 0x20;
      auVar197._8_4_ = fVar189;
      auVar197._12_4_ = fVar137 * fVar166 + fVar137 * fVar167;
      fVar84 = fVar188;
      if (fVar188 <= fVar54) {
        fVar84 = fVar54;
        fVar54 = fVar188;
      }
      auVar198._8_8_ = auVar197._8_8_;
      auVar198._0_8_ = auVar198._8_8_;
      auVar209._8_4_ = fVar151;
      auVar209._12_4_ = fVar150 * fVar166 + fVar150 * fVar167;
      if (fVar83 <= fVar115) {
        auVar209._0_4_ = fVar83;
      }
      if (auVar209._0_4_ <= fVar54) {
        fVar54 = auVar209._0_4_;
      }
      auVar15._4_8_ = auVar209._8_8_;
      auVar15._0_4_ = fVar166 * fVar97 + auVar196._4_4_;
      auVar210._0_8_ = auVar15._0_8_ << 0x20;
      auVar210._8_4_ = fVar165;
      auVar210._12_4_ = fVar166 * fVar114 + auVar196._12_4_;
      if (fVar83 <= fVar115) {
        fVar83 = fVar115;
      }
      auVar211._8_8_ = auVar210._8_8_;
      auVar211._0_8_ = auVar211._8_8_;
      if (fVar83 <= fVar84) {
        fVar83 = fVar84;
      }
      if (fVar189 <= fVar82) {
        auVar198._0_4_ = fVar82;
        fVar82 = fVar189;
      }
      fVar84 = fVar151;
      if (fVar165 <= fVar151) {
        fVar84 = fVar165;
      }
      if (fVar84 <= fVar82) {
        fVar82 = fVar84;
      }
      if (fVar165 <= fVar151) {
        auVar211._0_4_ = fVar151;
      }
      if (auVar211._0_4_ <= auVar198._0_4_) {
        auVar211._0_4_ = auVar198._0_4_;
      }
      bVar47 = 3 < (uint)uVar46;
      uVar16 = (undefined3)(uVar51 >> 8);
      local_2d8.ray = (RTCRayN *)(ulong)CONCAT31(uVar16,bVar47);
      fVar84 = auVar211._0_4_;
      if ((0.0001 <= fVar54) || (fVar84 <= -0.0001)) {
        if ((-0.0001 < fVar83 && fVar82 < 0.0001) ||
           ((fVar54 < 0.0001 && -0.0001 < fVar83 || (fVar82 < 0.0001 && -0.0001 < fVar84))))
        goto LAB_00b6c9b9;
        bVar19 = true;
        pRVar44 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar44 >> 8),fVar96 < 0.001);
      }
      else {
LAB_00b6c9b9:
        _local_378 = auVar259;
        local_418 = (RayQueryContext *)CONCAT44(fVar114,fVar113);
        bVar47 = bVar47 || fVar96 < 0.001;
        local_2d8.ray = (RTCRayN *)(ulong)CONCAT31(uVar16,bVar47);
        fVar165 = (float)(~-(uint)(fVar54 < 0.0) & 0x3f800000 | -(uint)(fVar54 < 0.0) & 0xbf800000);
        fVar151 = (float)(~-(uint)(fVar83 < 0.0) & 0x3f800000 | -(uint)(fVar83 < 0.0) & 0xbf800000);
        fVar115 = 0.0;
        if ((fVar165 == fVar151) && (!NAN(fVar165) && !NAN(fVar151))) {
          fVar115 = INFINITY;
        }
        fVar166 = 0.0;
        if ((fVar165 == fVar151) && (!NAN(fVar165) && !NAN(fVar151))) {
          fVar166 = -INFINITY;
        }
        fVar167 = (float)(~-(uint)(fVar82 < 0.0) & 0x3f800000 | -(uint)(fVar82 < 0.0) & 0xbf800000);
        if ((fVar165 != fVar167) || (fVar188 = fVar166, NAN(fVar165) || NAN(fVar167))) {
          if ((fVar82 != fVar54) || (NAN(fVar82) || NAN(fVar54))) {
            fVar188 = -fVar54 / (fVar82 - fVar54);
            fVar188 = (1.0 - fVar188) * 0.0 + fVar188;
            fVar82 = fVar188;
          }
          else {
            fVar82 = INFINITY;
            if ((fVar54 == 0.0) && (fVar82 = INFINITY, !NAN(fVar54))) {
              fVar82 = 0.0;
            }
            fVar188 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar54 == 0.0) & 1) * 4);
          }
          if (fVar82 <= fVar115) {
            fVar115 = fVar82;
          }
          if (fVar188 <= fVar166) {
            fVar188 = fVar166;
          }
        }
        auVar259._0_12_ = ZEXT812(0);
        auVar259._12_4_ = 0.0;
        pRVar44 = (RTCIntersectArguments *)(ulong)(fVar84 < 0.0);
        fVar54 = *(float *)(&DAT_01ff1ecc + (long)pRVar44 * 4);
        if ((fVar151 != fVar54) || (fVar82 = fVar188, NAN(fVar151) || NAN(fVar54))) {
          if ((fVar84 != fVar83) || (NAN(fVar84) || NAN(fVar83))) {
            fVar82 = -fVar83 / (fVar84 - fVar83);
            fVar82 = (1.0 - fVar82) * 0.0 + fVar82;
            fVar84 = fVar82;
          }
          else {
            fVar84 = INFINITY;
            if ((fVar83 == 0.0) && (fVar84 = INFINITY, !NAN(fVar83))) {
              fVar84 = 0.0;
            }
            pRVar44 = (RTCIntersectArguments *)(ulong)(-(uint)(fVar83 == 0.0) & 1);
            fVar82 = *(float *)(&DAT_01ff1ec4 + (long)pRVar44 * 4);
          }
          if (fVar84 <= fVar115) {
            fVar115 = fVar84;
          }
          if (fVar82 <= fVar188) {
            fVar82 = fVar188;
          }
        }
        if ((fVar167 != fVar54) || (NAN(fVar167) || NAN(fVar54))) {
          fVar115 = (float)(~-(uint)(fVar115 < 1.0) & 0x3f800000 |
                           (uint)fVar115 & -(uint)(fVar115 < 1.0));
          fVar82 = (float)(~-(uint)(fVar82 < 1.0) & (uint)fVar82 |
                          -(uint)(fVar82 < 1.0) & 0x3f800000);
        }
        fVar115 = (float)(~-(uint)(fVar115 < 0.0) & (uint)fVar115);
        fVar54 = (float)(~-(uint)(fVar82 < 1.0) & 0x3f800000 | (uint)fVar82 & -(uint)(fVar82 < 1.0))
        ;
        bVar19 = true;
        if (fVar115 <= fVar54) {
          fVar115 = fVar115 + -0.1;
          fVar54 = fVar54 + 0.1;
          uVar49 = -(uint)(fVar54 < 1.0);
          fVar115 = (float)(~-(uint)(fVar115 < 0.0) & (uint)fVar115);
          fVar190 = (float)(~uVar49 & 0x3f800000 | (uint)fVar54 & uVar49);
          fVar166 = 1.0 - fVar115;
          fVar167 = 1.0 - fVar115;
          fVar188 = 1.0 - fVar190;
          fVar189 = 1.0 - fVar190;
          fVar54 = auVar78._0_4_ * fVar166 + auVar78._8_4_ * fVar115;
          fVar82 = auVar78._4_4_ * fVar167 + auVar78._12_4_ * fVar115;
          fVar83 = auVar78._0_4_ * fVar188 + auVar78._8_4_ * fVar190;
          fVar84 = auVar78._4_4_ * fVar189 + auVar78._12_4_ * fVar190;
          fVar151 = fVar129 * fVar166 + fVar136 * fVar115;
          fVar165 = fVar131 * fVar167 + fVar137 * fVar115;
          fVar129 = fVar129 * fVar188 + fVar136 * fVar190;
          fVar131 = fVar131 * fVar189 + fVar137 * fVar190;
          fVar136 = fVar138 * fVar166 + fVar149 * fVar115;
          fVar137 = fVar98 * fVar167 + fVar150 * fVar115;
          fVar138 = fVar138 * fVar188 + fVar149 * fVar190;
          fVar98 = fVar98 * fVar189 + fVar150 * fVar190;
          fVar113 = fVar166 * fVar95 + fVar113 * fVar115;
          fVar114 = fVar167 * fVar97 + fVar114 * fVar115;
          fVar95 = fVar188 * fVar95 + fStack_420 * fVar190;
          fVar97 = fVar189 * fVar97 + fStack_41c * fVar190;
          local_3fc._4_4_ = fVar116 * (1.0 - fVar115) + fVar130 * fVar115;
          fStack_41c = fVar116 * (1.0 - fVar190) + fVar130 * fVar190;
          fVar96 = 1.0 / fVar96;
          auVar92._0_4_ = fVar95 - fVar113;
          auVar92._4_4_ = fVar97 - fVar114;
          auVar92._8_4_ = fVar95 - fVar95;
          auVar92._12_4_ = fVar97 - fVar97;
          auVar123._0_8_ = CONCAT44(fVar98 - fVar137,fVar138 - fVar136);
          auVar123._8_4_ = fVar138 - fVar138;
          auVar123._12_4_ = fVar98 - fVar98;
          auVar220._0_4_ = fVar129 - fVar151;
          auVar220._4_4_ = fVar131 - fVar165;
          auVar220._8_4_ = fVar129 - fVar129;
          auVar220._12_4_ = fVar131 - fVar131;
          auVar186._0_8_ = CONCAT44((fVar165 - fVar82) * 3.0,(fVar151 - fVar54) * 3.0);
          auVar186._8_4_ = (fVar129 - fVar83) * 3.0;
          auVar186._12_4_ = (fVar131 - fVar84) * 3.0;
          auVar145._0_8_ = CONCAT44((fVar137 - fVar165) * 3.0,(fVar136 - fVar151) * 3.0);
          auVar145._8_4_ = (fVar138 - fVar129) * 3.0;
          auVar145._12_4_ = (fVar98 - fVar131) * 3.0;
          auVar212._0_4_ = (fVar113 - fVar136) * 3.0;
          auVar212._4_4_ = (fVar114 - fVar137) * 3.0;
          auVar212._8_4_ = (fVar95 - fVar138) * 3.0;
          auVar212._12_4_ = (fVar97 - fVar98) * 3.0;
          auVar157._8_4_ = auVar145._8_4_;
          auVar157._0_8_ = auVar145._0_8_;
          auVar157._12_4_ = auVar145._12_4_;
          auVar208 = minps(auVar157,auVar212);
          auVar62 = maxps(auVar145,auVar212);
          auVar199._8_4_ = auVar186._8_4_;
          auVar199._0_8_ = auVar186._0_8_;
          auVar199._12_4_ = auVar186._12_4_;
          auVar100 = minps(auVar199,auVar208);
          auVar90 = maxps(auVar186,auVar62);
          auVar17._4_8_ = auVar62._8_8_;
          auVar17._0_4_ = auVar100._4_4_;
          auVar146._0_8_ = auVar17._0_8_ << 0x20;
          auVar146._8_4_ = auVar100._8_4_;
          auVar146._12_4_ = auVar100._12_4_;
          auVar147._8_8_ = auVar100._8_8_;
          auVar147._0_8_ = auVar146._8_8_;
          auVar18._4_8_ = auVar208._8_8_;
          auVar18._0_4_ = auVar90._4_4_;
          auVar158._0_8_ = auVar18._0_8_ << 0x20;
          auVar158._8_4_ = auVar90._8_4_;
          auVar158._12_4_ = auVar90._12_4_;
          auVar159._8_8_ = auVar90._8_8_;
          auVar159._0_8_ = auVar158._8_8_;
          auVar208 = minps(auVar100,auVar147);
          auVar62 = maxps(auVar90,auVar159);
          fVar188 = auVar208._0_4_ * fVar96;
          fVar189 = auVar208._4_4_ * fVar96;
          fVar190 = auVar208._8_4_ * fVar96;
          fVar204 = auVar208._12_4_ * fVar96;
          fVar136 = fVar96 * auVar62._0_4_;
          fVar138 = fVar96 * auVar62._4_4_;
          fVar149 = fVar96 * auVar62._8_4_;
          fVar96 = fVar96 * auVar62._12_4_;
          fVar166 = 1.0 / (fStack_41c - (float)local_3fc._4_4_);
          auVar111._0_8_ = CONCAT44(fVar84 - fVar82,fVar83 - fVar54);
          auVar111._8_4_ = fVar83 - fVar83;
          auVar111._12_4_ = fVar84 - fVar84;
          auVar160._8_4_ = auVar111._8_4_;
          auVar160._0_8_ = auVar111._0_8_;
          auVar160._12_4_ = auVar111._12_4_;
          auVar90 = minps(auVar160,auVar220);
          auVar208 = maxps(auVar111,auVar220);
          auVar79._8_4_ = auVar123._8_4_;
          auVar79._0_8_ = auVar123._0_8_;
          auVar79._12_4_ = auVar123._12_4_;
          auVar62 = minps(auVar79,auVar92);
          auVar90 = minps(auVar90,auVar62);
          auVar62 = maxps(auVar123,auVar92);
          auVar62 = maxps(auVar208,auVar62);
          fVar151 = auVar90._0_4_ * fVar166;
          fVar165 = auVar90._4_4_ * fVar166;
          fVar167 = fVar166 * auVar62._0_4_;
          fVar166 = fVar166 * auVar62._4_4_;
          fStack_3f4 = fStack_41c;
          uStack_3f0._4_4_ = fVar116 * 0.0 + fVar130 * 0.0;
          uStack_3f0._0_4_ = fVar116 * 0.0 + fVar130 * 0.0;
          auVar148._4_4_ = fStack_41c;
          auVar148._0_4_ = fStack_3e4;
          auVar148._8_4_ = (undefined4)uStack_3e0;
          auVar148._12_4_ = uStack_3e0._4_4_;
          local_1cc = (local_3e8 + fStack_3e4) * 0.5;
          fVar54 = ((float)local_3fc._4_4_ + fStack_41c) * 0.5;
          fVar82 = (fStack_3e4 + (float)(undefined4)uStack_3e0) * 0.0;
          fVar84 = (fStack_41c + uStack_3e0._4_4_) * 0.0;
          fVar95 = local_88 * local_1cc + (float)local_308;
          fVar113 = fStack_84 * local_1cc + local_308._4_4_;
          fVar83 = fStack_80 * local_1cc + (float)uStack_300;
          fVar97 = fStack_7c * local_1cc + uStack_300._4_4_;
          fVar114 = local_98 * local_1cc + (float)local_318._0_4_;
          fVar116 = fStack_94 * local_1cc + (float)local_318._4_4_;
          fVar129 = fStack_90 * local_1cc + fStack_310;
          fVar130 = fStack_8c * local_1cc + fStack_30c;
          fVar95 = (fVar114 - fVar95) * local_1cc + fVar95;
          fVar113 = (fVar116 - fVar113) * local_1cc + fVar113;
          fVar83 = (fVar129 - fVar83) * local_1cc + fVar83;
          fVar97 = (fVar130 - fVar97) * local_1cc + fVar97;
          fVar114 = (((local_a8 * local_1cc + (float)local_328) - fVar114) * local_1cc + fVar114) -
                    fVar95;
          fVar116 = (((fStack_a4 * local_1cc + local_328._4_4_) - fVar116) * local_1cc + fVar116) -
                    fVar113;
          fVar129 = (((fStack_a0 * local_1cc + (float)uStack_320) - fVar129) * local_1cc + fVar129)
                    - fVar83;
          fVar130 = (((fStack_9c * local_1cc + uStack_320._4_4_) - fVar130) * local_1cc + fVar130) -
                    fVar97;
          fVar95 = local_1cc * fVar114 + fVar95;
          fVar113 = local_1cc * fVar116 + fVar113;
          fVar114 = fVar114 * 3.0;
          fVar116 = fVar116 * 3.0;
          fVar83 = (local_1cc * fVar129 + fVar83) - fVar95;
          fVar97 = (local_1cc * fVar130 + fVar97) - fVar113;
          fVar114 = (fVar129 * 3.0 - fVar114) * fVar54 + fVar114;
          fVar116 = (fVar130 * 3.0 - fVar116) * fVar54 + fVar116;
          auVar93._0_8_ = CONCAT44(fVar114,fVar83) ^ 0x80000000;
          auVar93._8_4_ = fVar114;
          auVar93._12_4_ = fVar114;
          fVar205 = local_3e8 - local_1cc;
          fVar206 = (float)local_3fc._4_4_ - fVar54;
          fVar215 = fStack_3e4 - fVar82;
          fVar216 = fStack_41c - fVar84;
          fVar217 = fStack_3e4 - local_1cc;
          fVar222 = fStack_41c - fVar54;
          fVar82 = (float)(undefined4)uStack_3e0 - fVar82;
          fVar84 = uStack_3e0._4_4_ - fVar84;
          fVar95 = fVar83 * fVar54 + fVar95;
          fVar113 = fVar97 * fVar54 + fVar113;
          auVar112._0_8_ = CONCAT44(fVar116,fVar97) ^ 0x8000000000000000;
          auVar112._8_4_ = -fVar116;
          auVar112._12_4_ = -fVar116;
          auVar237._0_4_ = fVar97 * fVar114 - fVar116 * fVar83;
          auVar237._4_4_ = auVar237._0_4_;
          auVar237._8_4_ = auVar237._0_4_;
          auVar237._12_4_ = auVar237._0_4_;
          auVar208 = divps(auVar112,auVar237);
          auVar62 = divps(auVar93,auVar237);
          fVar116 = auVar208._0_4_;
          fVar129 = auVar208._4_4_;
          fVar97 = auVar62._0_4_;
          fVar114 = auVar62._4_4_;
          local_1cc = local_1cc - (fVar113 * fVar97 + fVar95 * fVar116);
          fStack_1c8 = fVar54 - (fVar113 * fVar114 + fVar95 * fVar129);
          fVar83 = fVar54 - (fVar113 * auVar62._8_4_ + fVar95 * auVar208._8_4_);
          fVar54 = fVar54 - (fVar113 * auVar62._12_4_ + fVar95 * auVar208._12_4_);
          auVar254._0_8_ = CONCAT44(fVar129 * fVar151,fVar129 * fVar188);
          auVar254._8_4_ = fVar129 * fVar189;
          auVar254._12_4_ = fVar129 * fVar165;
          auVar213._0_4_ = fVar129 * fVar136;
          auVar213._4_4_ = fVar129 * fVar167;
          auVar213._8_4_ = fVar129 * fVar138;
          auVar213._12_4_ = fVar129 * fVar166;
          auVar260._8_4_ = auVar254._8_4_;
          auVar260._0_8_ = auVar254._0_8_;
          auVar260._12_4_ = auVar254._12_4_;
          auVar100 = minps(auVar260,auVar213);
          auVar208 = maxps(auVar213,auVar254);
          auVar124._0_8_ = CONCAT44(fVar114 * fVar165,fVar114 * fVar189);
          auVar124._8_4_ = fVar114 * fVar190;
          auVar124._12_4_ = fVar114 * fVar204;
          auVar255._0_4_ = fVar114 * fVar138;
          auVar255._4_4_ = fVar114 * fVar166;
          auVar255._8_4_ = fVar114 * fVar149;
          auVar255._12_4_ = fVar114 * fVar96;
          auVar200._8_4_ = auVar124._8_4_;
          auVar200._0_8_ = auVar124._0_8_;
          auVar200._12_4_ = auVar124._12_4_;
          auVar62 = minps(auVar200,auVar255);
          auVar90 = maxps(auVar255,auVar124);
          fVar95 = 0.0 - (auVar90._0_4_ + auVar208._0_4_);
          fVar113 = 1.0 - (auVar90._4_4_ + auVar208._4_4_);
          fVar130 = 0.0 - (auVar90._8_4_ + auVar208._8_4_);
          fVar131 = 0.0 - (auVar90._12_4_ + auVar208._12_4_);
          fVar137 = 0.0 - (auVar62._0_4_ + auVar100._0_4_);
          fVar98 = 1.0 - (auVar62._4_4_ + auVar100._4_4_);
          fVar150 = 0.0 - (auVar62._8_4_ + auVar100._8_4_);
          fVar115 = 0.0 - (auVar62._12_4_ + auVar100._12_4_);
          auVar214._0_8_ = CONCAT44(fVar206 * fVar113,fVar205 * fVar95);
          auVar214._8_4_ = fVar215 * fVar130;
          auVar214._12_4_ = fVar216 * fVar131;
          auVar238._0_8_ = CONCAT44(fVar151 * fVar116,fVar188 * fVar116);
          auVar238._8_4_ = fVar189 * fVar116;
          auVar238._12_4_ = fVar165 * fVar116;
          auVar201._0_4_ = fVar116 * fVar136;
          auVar201._4_4_ = fVar116 * fVar167;
          auVar201._8_4_ = fVar116 * fVar138;
          auVar201._12_4_ = fVar116 * fVar166;
          auVar248._8_4_ = auVar238._8_4_;
          auVar248._0_8_ = auVar238._0_8_;
          auVar248._12_4_ = auVar238._12_4_;
          auVar208 = minps(auVar248,auVar201);
          auVar62 = maxps(auVar201,auVar238);
          auVar161._0_8_ = CONCAT44(fVar165 * fVar97,fVar189 * fVar97);
          auVar161._8_4_ = fVar190 * fVar97;
          auVar161._12_4_ = fVar204 * fVar97;
          auVar256._0_4_ = fVar97 * fVar138;
          auVar256._4_4_ = fVar97 * fVar166;
          auVar256._8_4_ = fVar97 * fVar149;
          auVar256._12_4_ = fVar97 * fVar96;
          auVar261._8_4_ = auVar161._8_4_;
          auVar261._0_8_ = auVar161._0_8_;
          auVar261._12_4_ = auVar161._12_4_;
          auVar90 = minps(auVar261,auVar256);
          auVar259._0_4_ = auVar90._0_4_ + auVar208._0_4_;
          auVar259._4_4_ = auVar90._4_4_ + auVar208._4_4_;
          auVar259._8_4_ = auVar90._8_4_ + auVar208._8_4_;
          auVar259._12_4_ = auVar90._12_4_ + auVar208._12_4_;
          auVar239._0_4_ = fVar205 * fVar137;
          auVar239._4_4_ = fVar206 * fVar98;
          auVar239._8_4_ = fVar215 * fVar150;
          auVar239._12_4_ = fVar216 * fVar115;
          auVar125._0_8_ = CONCAT44(fVar113 * fVar222,fVar95 * fVar217);
          auVar125._8_4_ = fVar130 * fVar82;
          auVar125._12_4_ = fVar131 * fVar84;
          auVar135._0_4_ = fVar137 * fVar217;
          auVar135._4_4_ = fVar98 * fVar222;
          auVar135._8_4_ = fVar150 * fVar82;
          auVar135._12_4_ = fVar115 * fVar84;
          auVar208 = maxps(auVar256,auVar161);
          fVar96 = 1.0 - (auVar208._0_4_ + auVar62._0_4_);
          fVar95 = 0.0 - (auVar208._4_4_ + auVar62._4_4_);
          fVar113 = 0.0 - (auVar208._8_4_ + auVar62._8_4_);
          fVar130 = 0.0 - (auVar208._12_4_ + auVar62._12_4_);
          auVar202._0_8_ = CONCAT44(fVar206 * fVar95,fVar205 * fVar96);
          auVar202._8_4_ = fVar215 * fVar113;
          auVar202._12_4_ = fVar216 * fVar130;
          auVar221._0_4_ = fVar205 * (1.0 - auVar259._0_4_);
          auVar221._4_4_ = fVar206 * (0.0 - auVar259._4_4_);
          auVar221._8_4_ = fVar215 * (0.0 - auVar259._8_4_);
          auVar221._12_4_ = fVar216 * (0.0 - auVar259._12_4_);
          auVar162._0_8_ = CONCAT44(fVar95 * fVar222,fVar96 * fVar217);
          auVar162._8_4_ = fVar113 * fVar82;
          auVar162._12_4_ = fVar130 * fVar84;
          auVar187._0_4_ = (1.0 - auVar259._0_4_) * fVar217;
          auVar187._4_4_ = (0.0 - auVar259._4_4_) * fVar222;
          auVar187._8_4_ = (0.0 - auVar259._8_4_) * fVar82;
          auVar187._12_4_ = (0.0 - auVar259._12_4_) * fVar84;
          auVar230._8_4_ = auVar202._8_4_;
          auVar230._0_8_ = auVar202._0_8_;
          auVar230._12_4_ = auVar202._12_4_;
          auVar62 = minps(auVar230,auVar221);
          auVar249._8_4_ = auVar162._8_4_;
          auVar249._0_8_ = auVar162._0_8_;
          auVar249._12_4_ = auVar162._12_4_;
          auVar208 = minps(auVar249,auVar187);
          auVar100 = minps(auVar62,auVar208);
          auVar208 = maxps(auVar221,auVar202);
          auVar62 = maxps(auVar187,auVar162);
          auVar90 = maxps(auVar62,auVar208);
          auVar163._8_4_ = auVar214._8_4_;
          auVar163._0_8_ = auVar214._0_8_;
          auVar163._12_4_ = auVar214._12_4_;
          auVar62 = minps(auVar163,auVar239);
          auVar203._8_4_ = auVar125._8_4_;
          auVar203._0_8_ = auVar125._0_8_;
          auVar203._12_4_ = auVar125._12_4_;
          auVar208 = minps(auVar203,auVar135);
          auVar208 = minps(auVar62,auVar208);
          auVar253 = maxps(auVar239,auVar214);
          auVar62 = maxps(auVar135,auVar125);
          auVar62 = maxps(auVar62,auVar253);
          auVar164._0_4_ = auVar100._4_4_ + auVar100._0_4_ + local_1cc;
          auVar164._4_4_ = auVar208._4_4_ + auVar208._0_4_ + fStack_1c8;
          auVar164._8_4_ = auVar100._8_4_ + auVar100._4_4_ + fVar83;
          auVar164._12_4_ = auVar100._12_4_ + auVar208._4_4_ + fVar54;
          fVar96 = auVar90._4_4_ + auVar90._0_4_ + local_1cc;
          fVar82 = auVar62._4_4_ + auVar62._0_4_ + fStack_1c8;
          auVar126._4_4_ = fVar82;
          auVar126._0_4_ = fVar96;
          auVar21._4_4_ = local_3fc._4_4_;
          auVar21._0_4_ = local_3e8;
          auVar21._8_4_ = fStack_3e4;
          auVar21._12_4_ = fStack_41c;
          auVar208 = maxps(auVar21,auVar164);
          auVar126._8_4_ = auVar90._8_4_ + auVar90._4_4_ + fVar83;
          auVar126._12_4_ = auVar90._12_4_ + auVar62._4_4_ + fVar54;
          auVar62 = minps(auVar126,auVar148);
          iVar42 = -(uint)(auVar62._0_4_ < auVar208._0_4_);
          iVar50 = -(uint)(auVar62._4_4_ < auVar208._4_4_);
          auVar128._4_4_ = iVar50;
          auVar128._0_4_ = iVar42;
          auVar128._8_4_ = iVar50;
          auVar128._12_4_ = iVar50;
          auVar127._8_8_ = auVar128._8_8_;
          auVar127._4_4_ = iVar42;
          auVar127._0_4_ = iVar42;
          uVar49 = movmskpd((int)pRVar44,auVar127);
          pRVar44 = (RTCIntersectArguments *)(ulong)uVar49;
          fStack_420 = fStack_3e4;
          if (uVar49 == 0) {
            pRVar44 = (RTCIntersectArguments *)0x0;
            if (auVar164._0_4_ <= local_3e8) {
              auVar259._0_12_ = ZEXT812(0x40400000);
              auVar259._12_4_ = 0.0;
            }
            else {
              auVar259._0_12_ = ZEXT812(0x40400000);
              auVar259._12_4_ = 0.0;
              if (fVar96 < fStack_3e4) {
                iVar42 = -(uint)(fVar82 < fStack_41c);
                pRVar44 = (RTCIntersectArguments *)
                          (ulong)CONCAT11((char)((uint)iVar42 >> 8),
                                          (byte)iVar42 & (float)local_3fc._4_4_ < auVar164._4_4_);
              }
            }
            bVar38 = bVar47 | (byte)pRVar44;
            local_2d8.ray = (RTCRayN *)(ulong)CONCAT31(uVar16,bVar38);
            if (bVar38 == 1) {
              local_2d8.ray = (RTCRayN *)&DAT_000000c8;
              do {
                fVar54 = 1.0 - local_1cc;
                fVar84 = local_1cc * local_1cc * local_1cc;
                fVar113 = auVar259._0_4_;
                fVar83 = local_1cc * local_1cc * fVar113 * fVar54;
                fVar96 = fVar54 * fVar54 * fVar54;
                fVar95 = local_1cc * fVar113 * fVar54 * fVar54;
                fVar54 = fVar96 * (float)local_308 +
                         fVar95 * (float)local_318._0_4_ +
                         fVar83 * (float)local_328 + fVar84 * (float)local_3d8._0_4_;
                fVar82 = fVar96 * local_308._4_4_ +
                         fVar95 * (float)local_318._4_4_ +
                         fVar83 * local_328._4_4_ + fVar84 * (float)local_3d8._4_4_;
                fVar54 = ((fVar96 * (float)uStack_300 +
                          fVar95 * fStack_310 + fVar83 * (float)uStack_320 + fVar84 * fStack_3d0) -
                         fVar54) * fStack_1c8 + fVar54;
                fVar82 = ((fVar96 * uStack_300._4_4_ +
                          fVar95 * fStack_30c +
                          fVar83 * uStack_320._4_4_ + fVar84 * aStack_3cc.field_0.x) - fVar82) *
                         fStack_1c8 + fVar82;
                local_1cc = local_1cc - (fVar82 * fVar97 + fVar54 * fVar116);
                fStack_1c8 = fStack_1c8 - (fVar82 * fVar114 + fVar54 * fVar129);
                fVar96 = ABS(fVar82);
                if (ABS(fVar82) <= ABS(fVar54)) {
                  fVar96 = ABS(fVar54);
                }
                if (fVar96 < local_2f8) {
                  if ((((0.0 <= local_1cc) && (local_1cc <= 1.0)) && (0.0 <= fStack_1c8)) &&
                     (fStack_1c8 <= 1.0)) {
                    fVar96 = (pre->ray_space).vx.field_0.m128[2];
                    fVar54 = (pre->ray_space).vy.field_0.m128[2];
                    fVar82 = (pre->ray_space).vz.field_0.m128[2];
                    fVar83 = (ray->super_RayK<1>).org.field_0.m128[0];
                    fVar84 = (ray->super_RayK<1>).org.field_0.m128[1];
                    fVar95 = (ray->super_RayK<1>).org.field_0.m128[2];
                    fVar130 = 1.0 - fStack_1c8;
                    fVar129 = 1.0 - local_1cc;
                    fVar97 = fVar129 * fVar129 * fVar129;
                    fVar114 = local_1cc * fVar113 * fVar129 * fVar129;
                    fVar116 = local_1cc * local_1cc * local_1cc;
                    fVar113 = local_1cc * local_1cc * fVar113 * fVar129;
                    fVar96 = (((fStack_330 - fVar95) * fVar82 +
                              (fStack_334 - fVar84) * fVar54 + (local_338 - fVar83) * fVar96) *
                              fVar130 +
                             ((fStack_380 - fVar95) * fVar82 +
                             (fStack_384 - fVar84) * fVar54 + (local_388 - fVar83) * fVar96) *
                             fStack_1c8) * fVar97 +
                             (((fStack_340 - fVar95) * fVar82 +
                              (fStack_344 - fVar84) * fVar54 + (local_348 - fVar83) * fVar96) *
                              fVar130 +
                             ((fStack_2a0 - fVar95) * fVar82 +
                             (fStack_2a4 - fVar84) * fVar54 + (local_2a8 - fVar83) * fVar96) *
                             fStack_1c8) * fVar114 +
                             (((fStack_360 - fVar95) * fVar82 +
                              (fStack_364 - fVar84) * fVar54 + (local_368 - fVar83) * fVar96) *
                              fVar130 +
                             ((fStack_3a0 - fVar95) * fVar82 +
                             (fStack_3a4 - fVar84) * fVar54 + (local_3a8 - fVar83) * fVar96) *
                             fStack_1c8) * fVar113 +
                             (fVar130 * ((fStack_350 - fVar95) * fVar82 +
                                        (fStack_354 - fVar84) * fVar54 +
                                        (local_358 - fVar83) * fVar96) +
                             ((fStack_390 - fVar95) * fVar82 +
                             (fStack_394 - fVar84) * fVar54 + (local_398 - fVar83) * fVar96) *
                             fStack_1c8) * fVar116;
                    if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar96) &&
                       (fVar54 = (ray->super_RayK<1>).tfar, fVar96 <= fVar54)) {
                      fVar95 = 1.0 - fStack_1c8;
                      fVar130 = 1.0 - fStack_1c8;
                      fVar131 = 1.0 - fStack_1c8;
                      fVar82 = local_348 * fVar95 + local_2a8 * fStack_1c8;
                      fVar83 = fStack_344 * fVar130 + fStack_2a4 * fStack_1c8;
                      fVar84 = fStack_340 * fVar131 + fStack_2a0 * fStack_1c8;
                      fVar136 = local_368 * fVar95 + local_3a8 * fStack_1c8;
                      fVar138 = fStack_364 * fVar130 + fStack_3a4 * fStack_1c8;
                      fVar149 = fStack_360 * fVar131 + fStack_3a0 * fStack_1c8;
                      fVar137 = fVar136 - fVar82;
                      fVar98 = fVar138 - fVar83;
                      fVar150 = fVar149 - fVar84;
                      fVar82 = (((fVar82 - (local_338 * fVar95 + local_388 * fStack_1c8)) * fVar129
                                + local_1cc * fVar137) * fVar129 +
                               (fVar137 * fVar129 +
                               ((fVar95 * local_358 + fStack_1c8 * local_398) - fVar136) * local_1cc
                               ) * local_1cc) * 3.0;
                      fVar83 = (((fVar83 - (fStack_334 * fVar130 + fStack_384 * fStack_1c8)) *
                                 fVar129 + local_1cc * fVar98) * fVar129 +
                               (fVar98 * fVar129 +
                               ((fVar130 * fStack_354 + fStack_1c8 * fStack_394) - fVar138) *
                               local_1cc) * local_1cc) * 3.0;
                      fVar84 = (((fVar84 - (fStack_330 * fVar131 + fStack_380 * fStack_1c8)) *
                                 fVar129 + local_1cc * fVar150) * fVar129 +
                               (fVar150 * fVar129 +
                               ((fVar131 * fStack_350 + fStack_1c8 * fStack_390) - fVar149) *
                               local_1cc) * local_1cc) * 3.0;
                      pGVar5 = (context->scene->geometries).items[(long)pRVar45].ptr;
                      uVar49 = (ray->super_RayK<1>).mask;
                      local_2d8.ray = (RTCRayN *)(ulong)uVar49;
                      pRVar44 = pRVar45;
                      if ((pGVar5->mask & uVar49) != 0) {
                        fVar95 = fVar97 * local_168 +
                                 fVar114 * local_178 + fVar113 * local_188 + fVar116 * local_198;
                        fVar129 = fVar97 * fStack_164 +
                                  fVar114 * fStack_174 + fVar113 * fStack_184 + fVar116 * fStack_194
                        ;
                        fVar97 = fVar97 * fStack_160 +
                                 fVar114 * fStack_170 + fVar113 * fStack_180 + fVar116 * fStack_190;
                        local_1d0 = fVar129 * fVar82 - fVar83 * fVar95;
                        fVar83 = fVar97 * fVar83 - fVar84 * fVar129;
                        fVar82 = fVar95 * fVar84 - fVar82 * fVar97;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar96;
                          *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar82,fVar83);
                          (ray->Ng).field_0.field_0.z = local_1d0;
                          ray->u = local_1cc;
                          ray->v = fStack_1c8;
                          ray->primID = (uint)local_3c0;
                          ray->geomID = uVar48;
                          ray->instID[0] = context->user->instID[0];
                          uVar49 = context->user->instPrimID[0];
                          local_2d8.ray = (RTCRayN *)(ulong)uVar49;
                          ray->instPrimID[0] = uVar49;
                        }
                        else {
                          local_1d8 = CONCAT44(fVar82,fVar83);
                          local_1c4 = (uint)local_3c0;
                          local_1c0 = uVar48;
                          local_1bc = context->user->instID[0];
                          pRVar44 = (RTCIntersectArguments *)(ulong)local_1bc;
                          local_1b8 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar96;
                          local_3fc._0_4_ = -NAN;
                          local_2d8.valid = (int *)local_3fc;
                          local_2d8.geometryUserPtr = pGVar5->userPtr;
                          local_2d8.context = context->user;
                          local_2d8.ray = (RTCRayN *)ray;
                          local_2d8.hit = (RTCHitN *)&local_1d8;
                          local_2d8.N = 1;
                          if ((pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                             ((*pGVar5->intersectionFilterN)(&local_2d8), context = local_418,
                             (((RayK<1> *)local_2d8.valid)->org).field_0.m128[0] != 0.0)) {
                            pRVar44 = context->args;
                            if (pRVar44->filter != (RTCFilterFunctionN)0x0) {
                              if (((pRVar44->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                   RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                                (*pRVar44->filter)(&local_2d8);
                                context = local_418;
                              }
                              if ((((RayK<1> *)local_2d8.valid)->org).field_0.m128[0] == 0.0)
                              goto LAB_00b6d756;
                            }
                            (((Vec3f *)((long)local_2d8.ray + 0x30))->field_0).field_0.x =
                                 *(float *)local_2d8.hit;
                            (((Vec3f *)((long)local_2d8.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_2d8.hit + 4);
                            (((Vec3f *)((long)local_2d8.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_2d8.hit + 8);
                            *(float *)((long)local_2d8.ray + 0x3c) = *(float *)(local_2d8.hit + 0xc)
                            ;
                            *(float *)((long)local_2d8.ray + 0x40) =
                                 *(float *)(local_2d8.hit + 0x10);
                            *(float *)((long)local_2d8.ray + 0x44) =
                                 *(float *)(local_2d8.hit + 0x14);
                            *(float *)((long)local_2d8.ray + 0x48) =
                                 *(float *)(local_2d8.hit + 0x18);
                            *(float *)((long)local_2d8.ray + 0x4c) =
                                 *(float *)(local_2d8.hit + 0x1c);
                            pRVar44 = (RTCIntersectArguments *)
                                      (ulong)(uint)*(float *)(local_2d8.hit + 0x20);
                            *(float *)((long)local_2d8.ray + 0x50) =
                                 *(float *)(local_2d8.hit + 0x20);
                          }
                          else {
LAB_00b6d756:
                            (ray->super_RayK<1>).tfar = fVar54;
                            local_2d8.ray = (RTCRayN *)local_2d8.valid;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                local_2d8.ray = (RTCRayN *)&((RayHit *)((long)local_2d8.ray + -0x60))->field_0x5f;
              } while (local_2d8.ray != (RTCRayN *)0x0);
            }
            else {
              bVar19 = false;
            }
          }
        }
      }
    } while (bVar19);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }